

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_pack1to4.h
# Opt level: O0

void ncnn::deformableconv2d_pack1to4_sse
               (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,Mat *top_blob,
               Mat *weight_data_packed,Mat *bias_data,int kernel_w,int kernel_h,int dilation_w,
               int dilation_h,int stride_w,int stride_h,int pad_left,int pad_top,int activation_type
               ,Mat *activation_params,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  undefined8 uVar106;
  undefined8 uVar107;
  undefined8 uVar108;
  undefined8 uVar109;
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined8 uVar117;
  size_type sVar118;
  const_reference pvVar119;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar120;
  float fVar121;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  undefined4 in_stack_00000038;
  long *in_stack_00000040;
  __m128 _conv_w0;
  __m128 _mask;
  __m128 _w4;
  __m128 _w3;
  __m128 _w2;
  __m128 _w1;
  __m128 _v4_channel0;
  __m128 _v3_channel0;
  __m128 _v2_channel0;
  __m128 _v1_channel0;
  __m128 _val_channel0;
  float *data_im_ptr;
  int ic;
  float *mask_ptr;
  float masks [4];
  float *w4_ptr;
  float w4s [4];
  float *w3_ptr;
  float w3s [4];
  float *w2_ptr;
  float w2s [4];
  float *w1_ptr;
  float w1s [4];
  float hw;
  float hh;
  float lw;
  float lh;
  int w_high;
  int h_high;
  int w_low;
  int h_low;
  int v4_pos;
  int v3_pos;
  int v2_pos;
  int v1_pos;
  bool v4_cond;
  bool v3_cond;
  bool v2_cond;
  bool v1_cond;
  float w4;
  float w3;
  float w2;
  float w1;
  bool cond;
  float w_im;
  float h_im;
  int m_c;
  Mat *mask;
  int x_c;
  int y_c;
  float mask_;
  float offset_w;
  float offset_h;
  int j;
  int i;
  __m128 _sum;
  float *outptr;
  float *kptr;
  int oc;
  int w_in;
  int h_in;
  int w_col;
  int h_col;
  float *zeros_ptr;
  float zeros [4];
  int wstep;
  int out_elempack;
  int elempack;
  float *bias_data_ptr;
  int maxk;
  int size;
  int outch;
  int outh;
  int outw;
  int inch;
  int h;
  int w;
  bool mask_not_pack;
  bool offset_not_pack;
  bool has_mask;
  Mat *offset;
  Mat *bottom_blob;
  Mat *m_1;
  Mat *m_8;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_2;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_4;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_3;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  bool local_299d;
  bool local_299c;
  bool local_299b;
  bool local_299a;
  bool local_2999;
  bool local_2869;
  undefined8 local_2868;
  undefined8 uStack_2860;
  undefined8 local_2858;
  undefined8 uStack_2850;
  undefined8 local_2848;
  undefined8 uStack_2840;
  undefined8 local_2838;
  undefined8 uStack_2830;
  undefined8 local_2828;
  undefined8 uStack_2820;
  undefined8 local_2818;
  undefined8 uStack_2810;
  undefined8 local_2808;
  undefined8 uStack_2800;
  undefined8 local_27f8;
  undefined8 uStack_27f0;
  undefined8 local_27e8;
  undefined8 uStack_27e0;
  undefined8 local_27d8;
  undefined8 uStack_27d0;
  undefined1 local_27c8 [8];
  undefined8 uStack_27c0;
  undefined8 local_27b8;
  undefined8 local_27b0;
  undefined8 local_27a8;
  undefined4 local_27a0;
  Allocator *local_2798;
  undefined4 local_2790;
  undefined4 local_278c;
  undefined4 local_2788;
  undefined4 local_2784;
  undefined4 local_2780;
  undefined8 local_2778;
  void *local_2770;
  int local_2764;
  float *local_2760;
  float local_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float *local_2740;
  float local_2738;
  float fStack_2734;
  float fStack_2730;
  float fStack_272c;
  float *local_2720;
  float local_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float *local_2700;
  float local_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float *local_26e0;
  float local_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float local_26c8;
  float local_26c4;
  float local_26c0;
  float local_26bc;
  int local_26b8;
  int local_26b4;
  int local_26b0;
  int local_26ac;
  int local_26a8;
  int local_26a4;
  int local_26a0;
  int local_269c;
  bool local_2698;
  bool local_2697;
  bool local_2696;
  bool local_2695;
  float local_2694;
  float local_2690;
  float local_268c;
  float local_2688;
  bool local_2681;
  float local_2680;
  float local_267c;
  undefined8 local_2678;
  undefined8 local_2670;
  undefined8 local_2668;
  undefined4 local_2660;
  Allocator *local_2658;
  undefined4 local_2650;
  undefined4 local_264c;
  undefined4 local_2648;
  undefined4 local_2644;
  undefined4 local_2640;
  undefined8 local_2638;
  int local_262c;
  undefined8 local_2628;
  undefined8 local_2620;
  undefined8 local_2618;
  undefined4 local_2610;
  Allocator *local_2608;
  undefined4 local_2600;
  undefined4 local_25fc;
  undefined4 local_25f8;
  undefined4 local_25f4;
  undefined4 local_25f0;
  undefined8 local_25e8;
  const_reference local_25e0;
  undefined8 local_25d8;
  undefined8 local_25d0;
  undefined8 local_25c8;
  undefined4 local_25c0;
  Allocator *local_25b8;
  undefined4 local_25b0;
  undefined4 local_25ac;
  undefined4 local_25a8;
  undefined4 local_25a4;
  undefined4 local_25a0;
  undefined8 local_2598;
  undefined8 local_2590;
  undefined8 local_2588;
  undefined8 local_2580;
  undefined4 local_2578;
  Allocator *local_2570;
  undefined4 local_2568;
  undefined4 local_2564;
  undefined4 local_2560;
  undefined4 local_255c;
  undefined4 local_2558;
  undefined8 local_2550;
  int local_2548;
  int local_2544;
  undefined8 local_2540;
  undefined8 local_2538;
  undefined8 local_2530;
  undefined4 local_2528;
  Allocator *local_2520;
  undefined4 local_2518;
  undefined4 local_2514;
  undefined4 local_2510;
  undefined4 local_250c;
  undefined4 local_2508;
  undefined8 local_2500;
  undefined8 local_24f8;
  undefined8 local_24f0;
  undefined8 local_24e8;
  undefined4 local_24e0;
  Allocator *local_24d8;
  undefined4 local_24d0;
  undefined4 local_24cc;
  undefined4 local_24c8;
  undefined4 local_24c4;
  undefined4 local_24c0;
  undefined8 local_24b8;
  float local_24ac;
  float local_24a8;
  float local_24a4;
  int local_24a0;
  int local_249c;
  undefined1 local_2498 [16];
  undefined8 local_2488;
  undefined8 local_2480;
  undefined8 local_2478;
  undefined4 local_2470;
  long local_2468;
  undefined4 local_2460;
  undefined4 local_245c;
  undefined4 local_2458;
  undefined4 local_2454;
  undefined4 local_2450;
  undefined8 local_2448;
  long local_2440;
  undefined8 local_2428;
  undefined8 local_2420;
  undefined8 local_2418;
  undefined4 local_2410;
  long local_2408;
  undefined4 local_2400;
  undefined4 local_23fc;
  undefined4 local_23f8;
  undefined4 local_23f4;
  undefined4 local_23f0;
  undefined8 local_23e8;
  undefined1 (*local_23e0) [16];
  int local_23d4;
  int local_23d0;
  int local_23cc;
  int local_23c8;
  int local_23c4;
  undefined1 (*local_23c0) [16];
  undefined1 local_23b8 [20];
  undefined4 local_23a4;
  undefined4 local_23a0;
  undefined4 local_239c;
  long local_2398;
  int local_238c;
  int local_2388;
  int local_2384;
  int local_2380;
  int local_237c;
  int local_2378;
  int local_2374;
  int local_2370;
  bool local_236b;
  byte local_236a;
  byte local_2369;
  const_reference local_2368;
  const_reference local_2360;
  int local_2358;
  int local_2354;
  long *local_2350;
  long *local_2348;
  long *local_2340;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2338;
  undefined1 local_232d;
  int local_232c;
  undefined8 *local_2320;
  undefined8 *local_2310;
  undefined8 *local_2300;
  undefined8 *local_22f8;
  undefined8 *local_22f0;
  undefined8 *local_22e8;
  undefined8 *local_22e0;
  undefined8 *local_22d8;
  undefined8 *local_22d0;
  undefined8 *local_22c8;
  undefined8 *local_22a0;
  undefined8 *local_2290;
  undefined8 *local_2280;
  undefined8 *local_2270;
  undefined8 *local_2260;
  undefined8 *local_2250;
  undefined8 *local_2240;
  undefined8 *local_2230;
  undefined8 *local_2210;
  undefined1 local_21f5;
  int local_21f4;
  const_reference local_21f0;
  undefined8 *local_21e8;
  undefined1 local_21c5;
  int local_21c4;
  const_reference local_21c0;
  undefined8 *local_21b8;
  undefined1 local_2195;
  int local_2194;
  const_reference local_2190;
  undefined8 *local_2188;
  undefined1 local_2165;
  int local_2164;
  const_reference local_2160;
  undefined8 *local_2158;
  undefined1 local_2135;
  int local_2134;
  const_reference local_2130;
  undefined8 *local_2128;
  undefined1 local_2105;
  int local_2104;
  const_reference local_2100;
  undefined8 *local_20f8;
  undefined1 local_20d5;
  int local_20d4;
  const_reference local_20d0;
  undefined8 *local_20c8;
  undefined1 local_20a5;
  int local_20a4;
  undefined8 *local_2098;
  int local_2074;
  undefined8 *local_2070;
  int local_2064;
  undefined8 *local_2060;
  int local_2054;
  undefined8 *local_2050;
  int local_2044;
  undefined8 *local_2040;
  int local_2034;
  undefined8 *local_2030;
  int local_2024;
  undefined8 *local_2020;
  undefined1 local_2018 [16];
  undefined1 (*local_2008) [16];
  undefined1 *local_2000;
  undefined8 *local_1ff8;
  undefined1 *local_1ff0;
  undefined1 *local_1fe8;
  undefined8 *local_1fe0;
  undefined8 *local_1fd8;
  undefined1 *local_1fd0;
  undefined8 *local_1fc8;
  undefined8 *local_1fc0;
  undefined1 *local_1fb8;
  undefined8 *local_1fb0;
  undefined8 *local_1fa8;
  undefined1 *local_1fa0;
  undefined8 *local_1f98;
  undefined8 *local_1f90;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined8 *local_1f60;
  undefined8 *local_1f58;
  long *local_1f50;
  long local_1f48;
  undefined4 local_1f3c;
  long local_1f38;
  undefined1 (*local_1f30) [16];
  undefined4 local_1f24;
  int local_1f20;
  int local_1f1c;
  undefined8 *local_1f18;
  Allocator *local_1f10;
  int local_1f04;
  size_t local_1f00;
  void *local_1ef8;
  int local_1eec;
  int local_1ee8;
  int local_1ee4;
  undefined8 *local_1ee0;
  Allocator *local_1ed8;
  int local_1ecc;
  size_t local_1ec8;
  void *local_1ec0;
  int local_1eb4;
  int local_1eb0;
  int local_1eac;
  undefined8 *local_1ea8;
  Allocator *local_1ea0;
  int local_1e94;
  size_t local_1e90;
  void *local_1e88;
  int local_1e7c;
  int local_1e78;
  int local_1e74;
  undefined8 *local_1e70;
  Allocator *local_1e68;
  int local_1e5c;
  size_t local_1e58;
  void *local_1e50;
  int local_1e44;
  int local_1e40;
  int local_1e3c;
  undefined8 *local_1e38;
  Allocator *local_1e30;
  int local_1e24;
  size_t local_1e20;
  void *local_1e18;
  int local_1e0c;
  int local_1e08;
  int local_1e04;
  undefined8 *local_1e00;
  Allocator *local_1df8;
  int local_1dec;
  size_t local_1de8;
  void *local_1de0;
  int local_1dd4;
  int local_1dd0;
  int local_1dcc;
  undefined8 *local_1dc8;
  Allocator *local_1dc0;
  int local_1db4;
  size_t local_1db0;
  void *local_1da8;
  int local_1d9c;
  int local_1d98;
  int local_1d94;
  undefined8 *local_1d90;
  long local_1d88;
  undefined4 local_1d7c;
  long local_1d78;
  long local_1d70;
  undefined4 local_1d64;
  int local_1d60;
  int local_1d5c;
  undefined8 *local_1d58;
  undefined4 local_1d4c;
  long local_1d48;
  undefined4 local_1d3c;
  long local_1d38;
  undefined4 local_1d2c;
  long local_1d28;
  undefined4 local_1d1c;
  long local_1d18;
  undefined4 local_1d0c;
  long local_1d08;
  undefined4 local_1cfc;
  long local_1cf8;
  undefined4 local_1cec;
  long local_1ce8;
  undefined4 local_1cdc;
  long local_1cd8;
  undefined4 local_1ccc;
  long local_1cc8;
  undefined8 *local_1cc0;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  float *local_1b20;
  float *local_1b18;
  float *local_1b10;
  float *local_1b08;
  float *local_1b00;
  undefined1 (*local_1af8) [16];
  undefined1 (*local_1af0) [16];
  undefined4 local_1ae8;
  undefined4 uStack_1ae4;
  undefined4 uStack_1ae0;
  undefined4 uStack_1adc;
  undefined4 local_1ad4;
  undefined4 *local_1ad0;
  undefined4 local_1ac8;
  undefined4 uStack_1ac4;
  undefined4 uStack_1ac0;
  undefined4 uStack_1abc;
  undefined4 local_1ab4;
  undefined4 *local_1ab0;
  undefined4 local_1aa8;
  undefined4 uStack_1aa4;
  undefined4 uStack_1aa0;
  undefined4 uStack_1a9c;
  undefined4 local_1a94;
  undefined4 *local_1a90;
  undefined4 local_1a88;
  undefined4 uStack_1a84;
  undefined4 uStack_1a80;
  undefined4 uStack_1a7c;
  undefined4 local_1a74;
  undefined4 *local_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined1 local_1a08 [8];
  undefined8 uStack_1a00;
  undefined1 local_19f8 [16];
  float local_19e8;
  float fStack_19e4;
  float fStack_19e0;
  float fStack_19dc;
  float local_19cc;
  float local_19c8;
  float fStack_19c4;
  float fStack_19c0;
  float fStack_19bc;
  float local_19ac;
  undefined4 local_19a8;
  undefined4 uStack_19a4;
  undefined4 uStack_19a0;
  undefined4 uStack_199c;
  undefined4 local_198c;
  undefined4 local_1988;
  undefined4 uStack_1984;
  undefined4 uStack_1980;
  undefined4 uStack_197c;
  undefined4 local_196c;
  undefined8 local_1968;
  long *local_1960;
  undefined8 local_1958;
  long *local_1950;
  undefined8 local_1948;
  long *local_1940;
  undefined8 local_1938;
  long *local_1930;
  undefined8 local_1928;
  long *local_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 *local_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  float local_188c;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  float local_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float local_183c;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined1 local_1828 [16];
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined1 local_17c8 [16];
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined1 local_1798 [16];
  undefined4 local_1788;
  undefined4 uStack_1784;
  undefined4 uStack_1780;
  undefined4 uStack_177c;
  undefined4 local_176c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined4 local_1758;
  undefined4 uStack_1754;
  undefined4 uStack_1750;
  undefined4 uStack_174c;
  undefined4 local_173c;
  undefined1 local_1738 [8];
  float fStack_1730;
  float fStack_172c;
  undefined1 local_1728 [12];
  float fStack_171c;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined1 local_1708 [8];
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined1 local_16e8 [16];
  undefined1 local_16d8 [16];
  undefined4 local_16c8;
  undefined4 uStack_16c4;
  undefined4 uStack_16c0;
  undefined4 uStack_16bc;
  undefined4 local_16ac;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined1 local_1698 [8];
  float fStack_1690;
  float fStack_168c;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  float local_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined1 local_15d8 [16];
  float local_15c8;
  float fStack_15c4;
  float fStack_15c0;
  float fStack_15bc;
  undefined1 local_15b8 [8];
  float fStack_15b0;
  float fStack_15ac;
  float local_15a8;
  float fStack_15a4;
  float fStack_15a0;
  float fStack_159c;
  undefined1 local_1598 [16];
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined1 local_1578 [8];
  undefined8 uStack_1570;
  undefined1 local_1568 [16];
  undefined4 local_1558;
  undefined4 uStack_1554;
  undefined4 uStack_1550;
  undefined4 uStack_154c;
  undefined1 local_1548 [16];
  undefined1 local_1538 [8];
  undefined8 uStack_1530;
  undefined1 local_1528 [8];
  undefined8 uStack_1520;
  undefined1 local_1518 [16];
  undefined1 local_1508 [16];
  undefined1 *local_14f8;
  undefined1 *local_14f0;
  undefined1 *local_14e8;
  float *local_14e0;
  undefined1 *local_14d8;
  undefined1 *local_14d0;
  float *local_14c8;
  undefined1 *local_14c0;
  undefined1 *local_14b8;
  float *local_14b0;
  undefined1 *local_14a8;
  undefined1 *local_14a0;
  float *local_1498;
  undefined1 *local_1490;
  undefined1 *local_1488;
  float *local_1480;
  undefined1 *local_1478;
  undefined1 *local_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined4 local_1428;
  undefined4 uStack_1424;
  undefined4 uStack_1420;
  undefined4 uStack_141c;
  undefined8 local_1418;
  undefined8 uStack_1410;
  float local_1408 [2];
  float afStack_1400 [2];
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  float local_13d8 [2];
  float afStack_13d0 [2];
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  float local_13a8 [2];
  float afStack_13a0 [2];
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  float local_1378 [2];
  float afStack_1370 [2];
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  float local_1348 [2];
  float afStack_1340 [2];
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined4 local_12e8;
  undefined4 uStack_12e4;
  undefined4 uStack_12e0;
  undefined4 uStack_12dc;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined4 local_12c8;
  undefined4 uStack_12c4;
  undefined4 uStack_12c0;
  undefined4 uStack_12bc;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined4 local_1288;
  undefined4 uStack_1284;
  undefined4 uStack_1280;
  undefined4 uStack_127c;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined1 local_1258 [8];
  undefined8 uStack_1250;
  undefined1 local_1248 [16];
  undefined4 local_1238;
  undefined4 uStack_1234;
  undefined4 uStack_1230;
  undefined4 uStack_122c;
  undefined1 local_1228 [16];
  undefined1 local_1218 [8];
  undefined8 uStack_1210;
  undefined1 local_1208 [8];
  undefined8 uStack_1200;
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  undefined1 *local_11d8;
  undefined1 *local_11d0;
  undefined1 *local_11c8;
  float *local_11c0;
  undefined1 *local_11b8;
  undefined1 *local_11b0;
  float *local_11a8;
  undefined1 *local_11a0;
  undefined1 *local_1198;
  float *local_1190;
  undefined1 *local_1188;
  undefined1 *local_1180;
  float *local_1178;
  undefined1 *local_1170;
  undefined1 *local_1168;
  float *local_1160;
  undefined1 *local_1158;
  undefined1 *local_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined4 local_1108;
  undefined4 uStack_1104;
  undefined4 uStack_1100;
  undefined4 uStack_10fc;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  float local_10e8 [2];
  float afStack_10e0 [2];
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  float local_10b8 [2];
  float afStack_10b0 [2];
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  float local_1088 [2];
  float afStack_1080 [2];
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  float local_1058 [2];
  float afStack_1050 [2];
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  float local_1028 [2];
  float afStack_1020 [2];
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined4 local_fa8;
  undefined4 uStack_fa4;
  undefined4 uStack_fa0;
  undefined4 uStack_f9c;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined4 local_f68;
  undefined4 uStack_f64;
  undefined4 uStack_f60;
  undefined4 uStack_f5c;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined1 *local_e08;
  float *local_e00;
  undefined1 *local_df8;
  undefined1 *local_df0;
  float *local_de8;
  undefined1 *local_de0;
  undefined1 *local_dd8;
  float *local_dd0;
  undefined1 *local_dc8;
  undefined1 *local_dc0;
  float *local_db8;
  undefined1 *local_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined4 local_d5c;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined4 local_d3c;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  float local_cf8 [2];
  float afStack_cf0 [2];
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  float local_cc8 [2];
  float afStack_cc0 [2];
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  float local_c98 [2];
  float afStack_c90 [2];
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  float local_c68 [2];
  float afStack_c60 [2];
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined4 local_c18;
  undefined4 uStack_c14;
  undefined4 uStack_c10;
  undefined4 uStack_c0c;
  undefined4 local_bfc;
  undefined4 local_bf8;
  undefined4 uStack_bf4;
  undefined4 uStack_bf0;
  undefined4 uStack_bec;
  undefined4 local_bdc;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined1 local_bc8 [8];
  float fStack_bc0;
  float fStack_bbc;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  float local_b88;
  float fStack_b84;
  float fStack_b80;
  float fStack_b7c;
  undefined1 local_b78 [16];
  undefined4 local_b68;
  undefined4 uStack_b64;
  undefined4 uStack_b60;
  undefined4 uStack_b5c;
  undefined4 local_b4c;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined1 local_af8 [8];
  undefined8 uStack_af0;
  undefined1 local_ae8 [16];
  undefined4 local_ad8;
  undefined4 uStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [8];
  undefined8 uStack_ab0;
  undefined1 local_aa8 [8];
  undefined8 uStack_aa0;
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 *local_a78;
  undefined1 *local_a70;
  undefined1 *local_a68;
  float *local_a60;
  undefined1 *local_a58;
  undefined1 *local_a50;
  float *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  float *local_a30;
  undefined1 *local_a28;
  undefined1 *local_a20;
  float *local_a18;
  undefined1 *local_a10;
  undefined1 *local_a08;
  float *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined1 local_9d8 [16];
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined4 local_9a8;
  undefined4 uStack_9a4;
  undefined4 uStack_9a0;
  undefined4 uStack_99c;
  undefined8 local_998;
  undefined8 uStack_990;
  float local_988 [2];
  float afStack_980 [2];
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  float local_958 [2];
  float afStack_950 [2];
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  float local_928 [2];
  float afStack_920 [2];
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  float local_8f8 [2];
  float afStack_8f0 [2];
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  float local_8c8 [2];
  float afStack_8c0 [2];
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined4 local_868;
  undefined4 uStack_864;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined4 local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined4 local_808;
  undefined4 uStack_804;
  undefined4 uStack_800;
  undefined4 uStack_7fc;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined1 local_798 [16];
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined1 *local_718;
  float *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  float *local_6f8;
  undefined1 *local_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined4 local_6bc;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  float local_688 [2];
  float afStack_680 [2];
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  float local_658 [2];
  float afStack_650 [2];
  undefined8 local_648;
  undefined8 uStack_640;
  undefined1 local_638 [8];
  undefined8 uStack_630;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  undefined1 local_5f8 [8];
  undefined8 uStack_5f0;
  undefined1 local_5e8 [16];
  undefined4 local_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [8];
  undefined8 uStack_5b0;
  undefined1 local_5a8 [16];
  undefined1 *local_598;
  float *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  float *local_578;
  undefined1 *local_570;
  float *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  float *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  float *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  float *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  float *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  float *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  float *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  float *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  float local_448 [2];
  float afStack_440 [2];
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  float local_418 [2];
  float afStack_410 [2];
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  float local_3e8 [2];
  float afStack_3e0 [2];
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  float local_3b8 [2];
  float afStack_3b0 [2];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  float local_388 [2];
  float afStack_380 [2];
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  float local_358 [2];
  float afStack_350 [2];
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  float local_328 [2];
  float afStack_320 [2];
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2f8 [2];
  float afStack_2f0 [2];
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  float local_2b8 [2];
  float afStack_2b0 [2];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  float local_288 [2];
  float afStack_280 [2];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined4 local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 *local_130;
  float *local_128;
  float *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108 [2];
  float afStack_100 [2];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_2358 = in_R9D;
  local_2354 = in_R8D;
  local_2350 = in_RCX;
  local_2348 = in_RDX;
  local_2340 = in_RSI;
  local_2338 = in_RDI;
  local_2360 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDI,0);
  local_2368 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2338,1);
  sVar118 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_2338);
  local_2369 = sVar118 == 3;
  local_236a = local_2368->elempack == 1;
  if ((bool)local_2369) {
    pvVar119 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2338,2);
    local_2869 = pvVar119->elempack == 1;
  }
  else {
    local_2869 = true;
  }
  local_236b = local_2869;
  local_2370 = local_2360->w;
  local_2374 = local_2360->h;
  local_2378 = local_2360->c;
  local_237c = *(int *)((long)local_2340 + 0x2c);
  local_2380 = (int)local_2340[6];
  local_2384 = (int)local_2340[7];
  local_2388 = local_237c * local_2380;
  local_238c = local_2354 * local_2358;
  local_1f50 = local_2350;
  local_2398 = *local_2350;
  local_239c = 1;
  local_23a0 = 4;
  local_23a4 = 4;
  memset(local_23b8,0,0x10);
  local_23c0 = (undefined1 (*) [16])local_23b8;
  for (local_23c4 = 0; local_23c4 < local_2380; local_23c4 = local_23c4 + 1) {
    for (local_23c8 = 0; local_23c8 < local_237c; local_23c8 = local_23c8 + 1) {
      local_23cc = local_23c4 * in_stack_00000020 - in_stack_00000030;
      local_23d0 = local_23c8 * in_stack_00000018 - in_stack_00000028;
      for (local_23d4 = 0; local_23d4 < local_2384; local_23d4 = local_23d4 + 1) {
        local_2098 = &local_2428;
        local_1f1c = *(int *)((long)local_2348 + 0x2c);
        local_1f20 = (int)local_2348[6];
        local_1f24 = *(undefined4 *)((long)local_2348 + 0x34);
        local_23e0 = (undefined1 (*) [16])
                     (*local_2348 + local_2348[8] * (long)local_23d4 * local_2348[2]);
        local_1f38 = local_2348[2];
        local_1f3c = (undefined4)local_2348[3];
        local_1f48 = local_2348[4];
        local_1f18 = &local_2428;
        local_2408 = local_1f48;
        local_1cc8 = (long)local_1f1c * (long)local_1f20 * local_1f38;
        local_1f58 = &local_2428;
        local_2310 = &local_2428;
        local_2428 = 0;
        local_2418 = 0;
        local_2410 = 0;
        local_23fc = 0;
        local_23f8 = 0;
        local_23f4 = 0;
        local_23f0 = 0;
        local_2420 = 0;
        local_2320 = &local_2488;
        local_1d5c = *(int *)((long)local_2340 + 0x2c);
        local_1d60 = (int)local_2340[6];
        local_1d64 = *(undefined4 *)((long)local_2340 + 0x34);
        local_2440 = *local_2340 + local_2340[8] * (long)local_23d4 * local_2340[2];
        local_1d78 = local_2340[2];
        local_1d7c = (undefined4)local_2340[3];
        local_1d88 = local_2340[4];
        local_1d58 = &local_2488;
        local_2468 = local_1d88;
        local_1d48 = (long)local_1d5c * (long)local_1d60 * local_1d78;
        local_1cc0 = &local_2488;
        local_2300 = &local_2488;
        local_23f0 = 0;
        local_23f4 = 0;
        local_23f8 = 0;
        local_23fc = 0;
        local_2410 = 0;
        local_2418 = 0;
        local_2420 = 0;
        local_2428 = 0;
        local_1ccc = 0x10;
        local_1d4c = 0x10;
        local_20a4 = local_23d4;
        local_20a5 = 1;
        local_232c = local_23d4;
        local_232d = 1;
        local_23e8 = 0;
        local_2400 = 0;
        local_2488 = 0;
        local_2478 = 0;
        local_2470 = 0;
        local_2460 = 0;
        local_245c = 0;
        local_2458 = 0;
        local_2454 = 0;
        local_2450 = 0;
        local_2448 = 0;
        local_2480 = 0;
        local_2018 = (undefined1  [16])0x0;
        local_2498 = (undefined1  [16])0x0;
        if (local_2398 != 0) {
          local_1af0 = (undefined1 (*) [16])(local_2398 + (long)(local_23d4 << 2) * 4);
          local_2498 = *local_1af0;
        }
        local_2230 = local_2300;
        local_2210 = local_2310;
        local_1f30 = local_23e0;
        local_1d70 = local_2440;
        for (local_249c = 0; uVar8 = local_16a8, auVar7 = _local_1728, local_249c < local_2358;
            local_249c = local_249c + 1) {
          for (local_24a0 = 0; local_24a0 < local_2354; local_24a0 = local_24a0 + 1) {
            if ((local_236a & 1) == 0) {
              local_2544 = (local_249c * local_2354 + local_24a0) * 2;
              local_2548 = (local_249c * local_2354 + local_24a0) * 2 + 1;
              local_2134 = local_2544 / local_2368->elempack;
              local_2128 = &local_2590;
              local_1e74 = local_2368->w;
              local_1e78 = local_2368->h;
              local_1e7c = local_2368->d;
              local_1e88 = (void *)((long)local_2368->data +
                                   local_2368->cstep * (long)local_2134 * local_2368->elemsize);
              local_1e90 = local_2368->elemsize;
              local_1e94 = local_2368->elempack;
              local_1ea0 = local_2368->allocator;
              local_1e70 = &local_2590;
              local_2570 = local_1ea0;
              local_1cf8 = (long)local_1e74 * (long)local_1e78 * local_1e90;
              local_2040 = &local_2590;
              local_24a4 = *(float *)((long)local_1e88 +
                                     (long)(local_23c8 * local_2368->elempack +
                                           local_2544 % local_2368->elempack) * 4 +
                                     (long)local_1e74 * (long)local_23c4 * local_1e90);
              local_22e8 = &local_2590;
              local_2590 = 0;
              local_2580 = 0;
              local_2578 = 0;
              local_2564 = 0;
              local_2560 = 0;
              local_255c = 0;
              local_2558 = 0;
              local_2588 = 0;
              local_2164 = local_2548 / local_2368->elempack;
              local_2158 = &local_25d8;
              local_1e3c = local_2368->w;
              local_1e40 = local_2368->h;
              local_1e44 = local_2368->d;
              local_1e50 = (void *)((long)local_2368->data +
                                   local_2368->cstep * (long)local_2164 * local_2368->elemsize);
              local_1e58 = local_2368->elemsize;
              local_1e5c = local_2368->elempack;
              local_1e68 = local_2368->allocator;
              local_1e38 = &local_25d8;
              local_25b8 = local_1e68;
              local_1d08 = (long)local_1e3c * (long)local_1e40 * local_1e58;
              local_2050 = &local_25d8;
              local_24a8 = *(float *)((long)local_1e50 +
                                     (long)(local_23c8 * local_2368->elempack +
                                           local_2548 % local_2368->elempack) * 4 +
                                     (long)local_1e3c * (long)local_23c4 * local_1e58);
              local_22e0 = &local_25d8;
              local_2558 = 0;
              local_255c = 0;
              local_2560 = 0;
              local_2564 = 0;
              local_2578 = 0;
              local_2580 = 0;
              local_2588 = 0;
              local_2590 = 0;
              local_1cfc = 0x10;
              local_1d0c = 0x10;
              local_2044 = local_23c4;
              local_2054 = local_23c4;
              local_2130 = local_2368;
              local_2135 = 1;
              local_2160 = local_2368;
              local_2165 = 1;
              local_2550 = 0;
              local_2568 = 0;
              local_25d8 = 0;
              local_25c8 = 0;
              local_25c0 = 0;
              local_25b0 = 0;
              local_25ac = 0;
              local_25a8 = 0;
              local_25a4 = 0;
              local_25a0 = 0;
              local_2598 = 0;
              local_25d0 = 0;
              local_2270 = local_22e0;
              local_2260 = local_22e8;
            }
            else {
              local_20d4 = (local_249c * local_2354 + local_24a0) * 2;
              local_20c8 = &local_24f8;
              local_1ee4 = local_2368->w;
              local_1ee8 = local_2368->h;
              local_1eec = local_2368->d;
              local_1ef8 = (void *)((long)local_2368->data +
                                   local_2368->cstep * (long)local_20d4 * local_2368->elemsize);
              local_1f00 = local_2368->elemsize;
              local_1f04 = local_2368->elempack;
              local_1f10 = local_2368->allocator;
              local_1ee0 = &local_24f8;
              local_24d8 = local_1f10;
              local_1cd8 = (long)local_1ee4 * (long)local_1ee8 * local_1f00;
              local_2020 = &local_24f8;
              local_24a4 = *(float *)((long)local_1ef8 +
                                     (long)local_23c8 * 4 +
                                     (long)local_1ee4 * (long)local_23c4 * local_1f00);
              local_22f8 = &local_24f8;
              local_24f8 = 0;
              local_24e8 = 0;
              local_24e0 = 0;
              local_24cc = 0;
              local_24c8 = 0;
              local_24c4 = 0;
              local_24c0 = 0;
              local_24f0 = 0;
              local_2104 = (local_249c * local_2354 + local_24a0) * 2 + 1;
              local_20f8 = &local_2540;
              local_1eac = local_2368->w;
              local_1eb0 = local_2368->h;
              local_1eb4 = local_2368->d;
              local_1ec0 = (void *)((long)local_2368->data +
                                   local_2368->cstep * (long)local_2104 * local_2368->elemsize);
              local_1ec8 = local_2368->elemsize;
              local_1ecc = local_2368->elempack;
              local_1ed8 = local_2368->allocator;
              local_1ea8 = &local_2540;
              local_2520 = local_1ed8;
              local_1ce8 = (long)local_1eac * (long)local_1eb0 * local_1ec8;
              local_2030 = &local_2540;
              local_24a8 = *(float *)((long)local_1ec0 +
                                     (long)local_23c8 * 4 +
                                     (long)local_1eac * (long)local_23c4 * local_1ec8);
              local_22f0 = &local_2540;
              local_24c0 = 0;
              local_24c4 = 0;
              local_24c8 = 0;
              local_24cc = 0;
              local_24e0 = 0;
              local_24e8 = 0;
              local_24f0 = 0;
              local_24f8 = 0;
              local_1cdc = 0x10;
              local_1cec = 0x10;
              local_2024 = local_23c4;
              local_2034 = local_23c4;
              local_20d0 = local_2368;
              local_20d5 = 1;
              local_2100 = local_2368;
              local_2105 = 1;
              local_24b8 = 0;
              local_24d0 = 0;
              local_2540 = 0;
              local_2530 = 0;
              local_2528 = 0;
              local_2518 = 0;
              local_2514 = 0;
              local_2510 = 0;
              local_250c = 0;
              local_2508 = 0;
              local_2500 = 0;
              local_2538 = 0;
              local_2250 = local_22f0;
              local_2240 = local_22f8;
            }
            local_24ac = 1.0;
            if ((local_2369 & 1) != 0) {
              local_25e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                     (local_2338,2);
              if ((local_236b & 1U) == 0) {
                local_262c = local_249c * local_2354 + local_24a0;
                local_21c4 = local_262c / local_25e0->elempack;
                local_21b8 = &local_2678;
                local_1dcc = local_25e0->w;
                local_1dd0 = local_25e0->h;
                local_1dd4 = local_25e0->d;
                local_1de0 = (void *)((long)local_25e0->data +
                                     local_25e0->cstep * (long)local_21c4 * local_25e0->elemsize);
                local_1de8 = local_25e0->elemsize;
                local_1dec = local_25e0->elempack;
                local_1df8 = local_25e0->allocator;
                local_1dc8 = &local_2678;
                local_2658 = local_1df8;
                local_1d28 = (long)local_1dcc * (long)local_1dd0 * local_1de8;
                local_2070 = &local_2678;
                local_24ac = *(float *)((long)local_1de0 +
                                       (long)(local_23c8 * local_25e0->elempack +
                                             local_262c % local_25e0->elempack) * 4 +
                                       (long)local_1dcc * (long)local_23c4 * local_1de8);
                local_22d0 = &local_2678;
                local_1d2c = 0x10;
                local_2074 = local_23c4;
                local_21c5 = 1;
                local_2678 = 0;
                local_2668 = 0;
                local_2660 = 0;
                local_2650 = 0;
                local_264c = 0;
                local_2648 = 0;
                local_2644 = 0;
                local_2640 = 0;
                local_2638 = 0;
                local_2670 = 0;
                local_2290 = local_22d0;
                local_21c0 = local_25e0;
              }
              else {
                local_2194 = local_249c * local_2354 + local_24a0;
                local_2188 = &local_2628;
                local_1e04 = local_25e0->w;
                local_1e08 = local_25e0->h;
                local_1e0c = local_25e0->d;
                local_1e18 = (void *)((long)local_25e0->data +
                                     local_25e0->cstep * (long)local_2194 * local_25e0->elemsize);
                local_1e20 = local_25e0->elemsize;
                local_1e24 = local_25e0->elempack;
                local_1e30 = local_25e0->allocator;
                local_1e00 = &local_2628;
                local_2608 = local_1e30;
                local_1d18 = (long)local_1e04 * (long)local_1e08 * local_1e20;
                local_2060 = &local_2628;
                local_24ac = *(float *)((long)local_1e18 +
                                       (long)local_23c8 * 4 +
                                       (long)local_1e04 * (long)local_23c4 * local_1e20);
                local_22d8 = &local_2628;
                local_1d1c = 0x10;
                local_2064 = local_23c4;
                local_2195 = 1;
                local_2628 = 0;
                local_2618 = 0;
                local_2610 = 0;
                local_2600 = 0;
                local_25fc = 0;
                local_25f8 = 0;
                local_25f4 = 0;
                local_25f0 = 0;
                local_25e8 = 0;
                local_2620 = 0;
                local_2280 = local_22d8;
                local_2190 = local_25e0;
              }
            }
            local_267c = (float)(local_23cc + local_249c * in_stack_00000010) + local_24a4;
            local_2680 = (float)(local_23d0 + local_24a0 * in_stack_00000008) + local_24a8;
            local_2999 = false;
            if (((-1.0 < local_267c) && (local_2999 = false, -1.0 < local_2680)) &&
               (local_2999 = false, local_267c < (float)local_2374)) {
              local_2999 = local_2680 < (float)local_2370;
            }
            local_2681 = local_2999;
            local_2688 = 0.0;
            local_268c = 0.0;
            local_2690 = 0.0;
            local_2694 = 0.0;
            local_2695 = false;
            local_2696 = false;
            local_2697 = false;
            local_2698 = false;
            local_269c = 0;
            local_26a0 = 0;
            local_26a4 = 0;
            local_26a8 = 0;
            if (local_2999 != false) {
              auVar7 = vroundss_avx((undefined1  [16])0x0,ZEXT416((uint)local_267c),9);
              local_26ac = (int)auVar7._0_4_;
              auVar7 = vroundss_avx(auVar7,ZEXT416((uint)local_2680),9);
              local_26b0 = (int)auVar7._0_4_;
              local_26b4 = local_26ac + 1;
              local_26b8 = local_26b0 + 1;
              local_26bc = local_267c - (float)local_26ac;
              local_26c0 = local_2680 - (float)local_26b0;
              local_26c4 = 1.0 - local_26bc;
              local_26c8 = 1.0 - local_26c0;
              local_299a = -1 < local_26ac && -1 < local_26b0;
              local_2695 = local_299a;
              bVar1 = local_26b8 <= local_2370 + -1;
              local_299b = -1 < local_26ac && bVar1;
              local_2696 = local_299b;
              bVar3 = local_26b4 <= local_2374 + -1;
              local_299c = bVar3 && -1 < local_26b0;
              local_2697 = local_299c;
              bVar4 = local_26b4 <= local_2374 + -1;
              bVar2 = local_26b8 <= local_2370 + -1;
              local_299d = bVar4 && bVar2;
              local_2698 = local_299d;
              if (-1 < local_26ac && -1 < local_26b0) {
                local_269c = local_26ac * local_2370 + local_26b0;
              }
              if (-1 < local_26ac && bVar1) {
                local_26a0 = local_26ac * local_2370 + local_26b8;
              }
              if (bVar3 && -1 < local_26b0) {
                local_26a4 = local_26b4 * local_2370 + local_26b0;
              }
              if (bVar4 && bVar2) {
                local_26a8 = local_26b4 * local_2370 + local_26b8;
              }
              local_2688 = local_26c4 * local_26c8;
              local_268c = local_26c4 * local_26c0;
              local_2690 = local_26bc * local_26c8;
              local_2694 = local_26bc * local_26c0;
            }
            local_26d8 = local_2688;
            fStack_26d4 = local_2688;
            fStack_26d0 = local_2688;
            fStack_26cc = local_2688;
            local_26e0 = &local_26d8;
            local_26f8 = local_268c;
            fStack_26f4 = local_268c;
            fStack_26f0 = local_268c;
            fStack_26ec = local_268c;
            local_2700 = &local_26f8;
            local_2718 = local_2690;
            fStack_2714 = local_2690;
            fStack_2710 = local_2690;
            fStack_270c = local_2690;
            local_2720 = &local_2718;
            local_2738 = local_2694;
            fStack_2734 = local_2694;
            fStack_2730 = local_2694;
            fStack_272c = local_2694;
            local_2740 = &local_2738;
            local_2758 = local_24ac;
            fStack_2754 = local_24ac;
            fStack_2750 = local_24ac;
            fStack_274c = local_24ac;
            local_2760 = &local_2758;
            for (local_2764 = 0; local_2764 < local_2378; local_2764 = local_2764 + 1) {
              local_21e8 = &local_27b8;
              local_1d94 = local_2360->w;
              local_1d98 = local_2360->h;
              local_1d9c = local_2360->d;
              local_2770 = (void *)((long)local_2360->data +
                                   local_2360->cstep * (long)local_2764 * local_2360->elemsize);
              local_1db0 = local_2360->elemsize;
              local_1db4 = local_2360->elempack;
              local_1dc0 = local_2360->allocator;
              local_1d90 = &local_27b8;
              local_1d38 = (long)local_1d94 * (long)local_1d98 * local_1db0;
              local_1d3c = 0x10;
              local_21f0 = local_2360;
              local_21f4 = local_2764;
              local_21f5 = 1;
              local_1f60 = &local_27b8;
              local_22c8 = &local_27b8;
              local_27b8 = 0;
              local_27a8 = 0;
              local_27a0 = 0;
              local_2790 = 0;
              local_278c = 0;
              local_2788 = 0;
              local_2784 = 0;
              local_2780 = 0;
              local_2778 = 0;
              local_27b0 = 0;
              local_1af8 = local_23c0;
              uVar8 = *(undefined8 *)*local_23c0;
              uVar9 = *(undefined8 *)(*local_23c0 + 8);
              _local_27c8 = *local_23c0;
              if (local_2999 != false) {
                local_27d8 = uVar8;
                uStack_27d0 = uVar9;
                if (local_2695 != false) {
                  local_1a70 = (undefined4 *)((long)local_2770 + (long)local_269c * 4);
                  local_1a88 = *local_1a70;
                  local_27d8 = CONCAT44(local_1a88,local_1a88);
                  uStack_27d0 = CONCAT44(local_1a88,local_1a88);
                  uStack_1a84 = local_1a88;
                  uStack_1a80 = local_1a88;
                  uStack_1a7c = local_1a88;
                  local_1a74 = local_1a88;
                }
                local_27e8 = uVar8;
                uStack_27e0 = uVar9;
                if (local_2696 != false) {
                  local_1a90 = (undefined4 *)((long)local_2770 + (long)local_26a0 * 4);
                  local_1aa8 = *local_1a90;
                  local_27e8 = CONCAT44(local_1aa8,local_1aa8);
                  uStack_27e0 = CONCAT44(local_1aa8,local_1aa8);
                  uStack_1aa4 = local_1aa8;
                  uStack_1aa0 = local_1aa8;
                  uStack_1a9c = local_1aa8;
                  local_1a94 = local_1aa8;
                }
                local_27f8 = uVar8;
                uStack_27f0 = uVar9;
                if (local_2697 != false) {
                  local_1ab0 = (undefined4 *)((long)local_2770 + (long)local_26a4 * 4);
                  local_1ac8 = *local_1ab0;
                  local_27f8 = CONCAT44(local_1ac8,local_1ac8);
                  uStack_27f0 = CONCAT44(local_1ac8,local_1ac8);
                  uStack_1ac4 = local_1ac8;
                  uStack_1ac0 = local_1ac8;
                  uStack_1abc = local_1ac8;
                  local_1ab4 = local_1ac8;
                }
                local_2808 = uVar8;
                uStack_2800 = uVar9;
                if (local_2698 != false) {
                  local_1ad0 = (undefined4 *)((long)local_2770 + (long)local_26a8 * 4);
                  local_1ae8 = *local_1ad0;
                  local_2808 = CONCAT44(local_1ae8,local_1ae8);
                  uStack_2800 = CONCAT44(local_1ae8,local_1ae8);
                  uStack_1ae4 = local_1ae8;
                  uStack_1ae0 = local_1ae8;
                  uStack_1adc = local_1ae8;
                  local_1ad4 = local_1ae8;
                }
                local_2818 = CONCAT44(local_2688,local_2688);
                uStack_2810 = CONCAT44(local_2688,local_2688);
                auVar87._4_4_ = local_2688;
                auVar87._0_4_ = local_2688;
                auVar87._8_4_ = local_2688;
                auVar87._12_4_ = local_2688;
                local_2828 = CONCAT44(local_268c,local_268c);
                uStack_2820 = CONCAT44(local_268c,local_268c);
                auVar86._4_4_ = local_268c;
                auVar86._0_4_ = local_268c;
                auVar86._8_4_ = local_268c;
                auVar86._12_4_ = local_268c;
                local_2838 = CONCAT44(local_2690,local_2690);
                uStack_2830 = CONCAT44(local_2690,local_2690);
                auVar85._4_4_ = local_2690;
                auVar85._0_4_ = local_2690;
                auVar85._8_4_ = local_2690;
                auVar85._12_4_ = local_2690;
                local_2848 = CONCAT44(local_2694,local_2694);
                uStack_2840 = CONCAT44(local_2694,local_2694);
                auVar84._4_4_ = local_2694;
                auVar84._0_4_ = local_2694;
                auVar84._8_4_ = local_2694;
                auVar84._12_4_ = local_2694;
                local_1f90 = &local_27d8;
                local_1f98 = &local_2818;
                local_1fa0 = local_27c8;
                local_1bf8 = local_27d8;
                uStack_1bf0 = uStack_27d0;
                auVar7._8_8_ = uStack_27d0;
                auVar7._0_8_ = local_27d8;
                local_1c18 = local_27c8;
                uStack_1c10 = uStack_27c0;
                auVar7 = vfmadd213ps_fma(auVar87,auVar7,_local_27c8);
                local_1fa8 = &local_27e8;
                local_1fb0 = &local_2828;
                local_1fb8 = local_27c8;
                local_1bc8 = local_27e8;
                uStack_1bc0 = uStack_27e0;
                auVar82._8_8_ = uStack_27e0;
                auVar82._0_8_ = local_27e8;
                local_27c8 = auVar7._0_8_;
                local_1be8 = local_27c8;
                uStack_27c0 = auVar7._8_8_;
                uStack_1be0 = uStack_27c0;
                auVar7 = vfmadd213ps_fma(auVar86,auVar82,auVar7);
                local_1fc0 = &local_27f8;
                local_1fc8 = &local_2838;
                local_1fd0 = local_27c8;
                local_1b98 = local_27f8;
                uStack_1b90 = uStack_27f0;
                auVar6._8_8_ = uStack_27f0;
                auVar6._0_8_ = local_27f8;
                local_27c8 = auVar7._0_8_;
                local_1bb8 = local_27c8;
                uStack_27c0 = auVar7._8_8_;
                uStack_1bb0 = uStack_27c0;
                auVar7 = vfmadd213ps_fma(auVar85,auVar6,auVar7);
                local_1fd8 = &local_2808;
                local_1fe0 = &local_2848;
                local_1fe8 = local_27c8;
                local_1b68 = local_2808;
                uStack_1b60 = uStack_2800;
                auVar5._8_8_ = uStack_2800;
                auVar5._0_8_ = local_2808;
                local_27c8 = auVar7._0_8_;
                local_1b88 = local_27c8;
                uStack_27c0 = auVar7._8_8_;
                uStack_1b80 = uStack_27c0;
                _local_27c8 = vfmadd213ps_fma(auVar84,auVar5,auVar7);
                local_1c08 = local_2818;
                uStack_1c00 = uStack_2810;
                local_1bd8 = local_2828;
                uStack_1bd0 = uStack_2820;
                local_1ba8 = local_2838;
                uStack_1ba0 = uStack_2830;
                local_1b78 = local_2848;
                uStack_1b70 = uStack_2840;
                local_1b18 = local_2740;
                local_1b10 = local_2720;
                local_1b08 = local_2700;
                local_1b00 = local_26e0;
              }
              if ((local_2369 & 1) != 0) {
                local_2858 = CONCAT44(local_24ac,local_24ac);
                uStack_2850 = CONCAT44(local_24ac,local_24ac);
                local_1f78 = local_27c8;
                uVar8 = local_1f78;
                uStack_1f70 = uStack_27c0;
                uVar9 = uStack_1f70;
                local_1f78._0_4_ = local_27c8._0_4_;
                local_1f78._4_4_ = local_27c8._4_4_;
                uStack_1f70._0_4_ = local_27c8._8_4_;
                uStack_1f70._4_4_ = local_27c8._12_4_;
                local_27c8._4_4_ = local_1f78._4_4_ * local_24ac;
                local_27c8._0_4_ = (float)local_1f78 * local_24ac;
                uStack_27c0._0_4_ = (float)uStack_1f70 * local_24ac;
                uStack_27c0._4_4_ = uStack_1f70._4_4_ * local_24ac;
                local_1f88 = local_2858;
                uStack_1f80 = uStack_2850;
                local_1f78 = uVar8;
                uStack_1f70 = uVar9;
                local_1b20 = local_2760;
              }
              local_2008 = local_23e0;
              local_2868 = *(undefined8 *)*local_23e0;
              uStack_2860 = *(undefined8 *)(*local_23e0 + 8);
              local_1ff0 = local_27c8;
              local_1ff8 = &local_2868;
              local_2000 = local_2498;
              local_1b38 = local_27c8;
              uStack_1b30 = uStack_27c0;
              local_1b58 = local_2498._0_8_;
              uStack_1b50 = local_2498._8_8_;
              local_2498 = vfmadd213ps_fma(*local_23e0,_local_27c8,local_2498);
              local_23e0 = local_23e0 + 1;
              local_22a0 = local_22c8;
              local_1da8 = local_2770;
              local_1b48 = local_2868;
              uStack_1b40 = uStack_2860;
              local_2798 = local_1dc0;
            }
          }
        }
        local_1a18 = local_2498._0_8_;
        uStack_1a10 = local_2498._8_8_;
        local_1728._8_4_ = local_2498._8_4_;
        fStack_171c = local_2498._12_4_;
        local_16a8._0_4_ = local_2498._0_4_;
        fVar120 = (float)local_16a8;
        local_16a8._4_4_ = local_2498._4_4_;
        fVar121 = local_16a8._4_4_;
        _local_1728 = auVar7;
        local_16a8 = uVar8;
        switch(in_stack_00000038) {
        case 1:
          local_19f8 = (undefined1  [16])0x0;
          local_18e8 = local_2498._0_8_;
          uStack_18e0 = local_2498._8_8_;
          local_18f8 = 0;
          uStack_18f0 = 0;
          _local_1a08 = vmaxps_avx(local_2498,ZEXT816(0));
          break;
        case 2:
          local_1920 = in_stack_00000040;
          local_1928 = 0;
          local_188c = *(float *)*in_stack_00000040;
          local_1888 = local_2498._0_8_;
          uStack_1880 = local_2498._8_8_;
          local_1868 = (undefined1  [16])0x0;
          local_1808 = 0;
          uStack_1800 = 0;
          local_1818 = local_2498._0_8_;
          uStack_1810 = local_2498._8_8_;
          local_18a8 = vmaxps_avx(ZEXT816(0),local_2498);
          local_1878 = (undefined1  [16])0x0;
          local_17e8 = 0;
          uStack_17e0 = 0;
          local_17f8 = local_2498._0_8_;
          uStack_17f0 = local_2498._8_8_;
          local_18b8 = vminps_avx(ZEXT816(0),local_2498);
          local_1828._4_4_ = local_188c;
          local_1828._0_4_ = local_188c;
          local_1828._8_4_ = local_188c;
          local_1828._12_4_ = local_188c;
          local_1838 = local_18b8._0_8_;
          uVar8 = local_1838;
          uStack_1830 = local_18b8._8_8_;
          uVar9 = uStack_1830;
          local_1838._0_4_ = local_18b8._0_4_;
          local_1838._4_4_ = local_18b8._4_4_;
          uStack_1830._0_4_ = local_18b8._8_4_;
          uStack_1830._4_4_ = local_18b8._12_4_;
          local_15c8 = local_188c * (float)local_1838;
          fStack_15c4 = local_188c * local_1838._4_4_;
          fStack_15c0 = local_188c * (float)uStack_1830;
          fStack_15bc = local_188c * uStack_1830._4_4_;
          local_15b8._0_4_ = local_18a8._0_4_;
          local_15b8._4_4_ = local_18a8._4_4_;
          fStack_15b0 = local_18a8._8_4_;
          fStack_15ac = local_18a8._12_4_;
          local_1a08._4_4_ = (float)local_15b8._4_4_ + fStack_15c4;
          local_1a08._0_4_ = (float)local_15b8._0_4_ + local_15c8;
          uStack_1a00._0_4_ = fStack_15b0 + fStack_15c0;
          uStack_1a00._4_4_ = fStack_15ac + fStack_15bc;
          local_1858 = local_188c;
          fStack_1854 = local_188c;
          fStack_1850 = local_188c;
          fStack_184c = local_188c;
          local_183c = local_188c;
          local_1838 = uVar8;
          uStack_1830 = uVar9;
          _local_15b8 = local_18a8;
          break;
        case 3:
          local_1930 = in_stack_00000040;
          local_1938 = 0;
          local_1988 = *(undefined4 *)*in_stack_00000040;
          local_1a38 = CONCAT44(local_1988,local_1988);
          uStack_1a30 = CONCAT44(local_1988,local_1988);
          local_1940 = in_stack_00000040;
          local_1948 = 1;
          local_19a8 = *(undefined4 *)(*in_stack_00000040 + 4);
          local_1a48 = CONCAT44(local_19a8,local_19a8);
          uStack_1a40 = CONCAT44(local_19a8,local_19a8);
          local_18c8 = local_2498._0_8_;
          uStack_18c0 = local_2498._8_8_;
          auVar10._8_8_ = uStack_1a30;
          auVar10._0_8_ = local_1a38;
          local_17c8 = vmaxps_avx(local_2498,auVar10);
          auVar11._8_8_ = uStack_1a40;
          auVar11._0_8_ = local_1a48;
          _local_1a08 = vminps_avx(local_17c8,auVar11);
          uStack_19a4 = local_19a8;
          uStack_19a0 = local_19a8;
          uStack_199c = local_19a8;
          local_198c = local_19a8;
          uStack_1984 = local_1988;
          uStack_1980 = local_1988;
          uStack_197c = local_1988;
          local_196c = local_1988;
          local_18d8 = local_1a38;
          uStack_18d0 = uStack_1a30;
          local_17d8 = local_1a48;
          uStack_17d0 = uStack_1a40;
          break;
        case 4:
          local_17a8 = local_2498._0_8_;
          uStack_17a0 = local_2498._8_8_;
          local_176c = 0x3f800000;
          local_1788 = 0x3f800000;
          uStack_1784 = 0x3f800000;
          uStack_1780 = 0x3f800000;
          uStack_177c = 0x3f800000;
          local_17b8 = 0x3f8000003f800000;
          uStack_17b0 = 0x3f8000003f800000;
          local_15d8._8_8_ = 0x3f8000003f800000;
          local_15d8._0_8_ = 0x3f8000003f800000;
          local_1798 = (undefined1  [16])0x0;
          local_ef8 = 0;
          uStack_ef0 = 0;
          local_f08 = local_2498._0_8_;
          uStack_f00 = local_2498._8_8_;
          auVar7 = vsubps_avx(ZEXT816(0),local_2498);
          local_11e8 = (undefined1  [16])0x0;
          local_1238 = 0x3f800000;
          uStack_1234 = 0x3f800000;
          uStack_1230 = 0x3f800000;
          uStack_122c = 0x3f800000;
          local_11f8._0_8_ = auVar7._0_8_;
          local_11f8._8_8_ = auVar7._8_8_;
          local_f98 = local_11f8._0_8_;
          uStack_f90 = local_11f8._8_8_;
          local_fa8 = 0x42b0c0a5;
          uStack_fa4 = 0x42b0c0a5;
          uStack_fa0 = 0x42b0c0a5;
          uStack_f9c = 0x42b0c0a5;
          auVar28._8_4_ = 0x42b0c0a5;
          auVar28._0_8_ = 0x42b0c0a542b0c0a5;
          auVar28._12_4_ = 0x42b0c0a5;
          auVar7 = vminps_avx(auVar7,auVar28);
          local_11f8._0_8_ = auVar7._0_8_;
          local_11f8._8_8_ = auVar7._8_8_;
          local_fb8 = local_11f8._0_8_;
          uStack_fb0 = local_11f8._8_8_;
          local_fc8 = 0xc2b0c0a5;
          uStack_fc4 = 0xc2b0c0a5;
          uStack_fc0 = 0xc2b0c0a5;
          uStack_fbc = 0xc2b0c0a5;
          auVar27._8_4_ = 0xc2b0c0a5;
          auVar27._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar27._12_4_ = 0xc2b0c0a5;
          auVar6 = vmaxps_avx(auVar7,auVar27);
          local_11f8._0_8_ = auVar6._0_8_;
          local_11f8._8_8_ = auVar6._8_8_;
          local_10f8 = local_11f8._0_8_;
          uVar90 = local_10f8;
          uStack_10f0 = local_11f8._8_8_;
          uVar91 = uStack_10f0;
          local_1108 = 0x3fb8aa3b;
          uStack_1104 = 0x3fb8aa3b;
          uStack_1100 = 0x3fb8aa3b;
          uStack_10fc = 0x3fb8aa3b;
          local_10f8._0_4_ = auVar6._0_4_;
          local_10f8._4_4_ = auVar6._4_4_;
          uStack_10f0._0_4_ = auVar6._8_4_;
          uStack_10f0._4_4_ = auVar6._12_4_;
          local_1218._4_4_ = local_10f8._4_4_ * 1.442695;
          local_1218._0_4_ = (float)local_10f8 * 1.442695;
          uStack_1210._0_4_ = (float)uStack_10f0 * 1.442695;
          uStack_1210._4_4_ = uStack_10f0._4_4_ * 1.442695;
          local_f58 = local_1218;
          uStack_f50 = uStack_1210;
          local_f68 = 0x3f000000;
          uStack_f64 = 0x3f000000;
          uStack_f60 = 0x3f000000;
          uStack_f5c = 0x3f000000;
          local_1218._0_4_ = (float)local_10f8 * 1.442695 + 0.5;
          local_1218._4_4_ = local_10f8._4_4_ * 1.442695 + 0.5;
          fVar120 = (float)uStack_10f0 * 1.442695 + 0.5;
          fVar121 = uStack_10f0._4_4_ * 1.442695 + 0.5;
          uStack_1210._0_4_ = fVar120;
          uStack_1210._4_4_ = fVar121;
          local_ed8 = local_1218;
          uStack_ed0 = uStack_1210;
          local_1228._4_4_ = (int)(float)local_1218._4_4_;
          local_1228._0_4_ = (int)(float)local_1218._0_4_;
          local_1228._8_4_ = (int)fVar120;
          local_1228._12_4_ = (int)fVar121;
          local_ea8 = local_1228._0_8_;
          uStack_ea0 = local_1228._8_8_;
          auVar29._8_8_ = local_1228._8_8_;
          auVar29._0_8_ = local_1228._0_8_;
          auVar5 = vcvtdq2ps_avx(auVar29);
          local_1208 = auVar5._0_8_;
          uStack_1200 = auVar5._8_8_;
          local_e78 = local_1208;
          uStack_e70 = uStack_1200;
          local_e88 = local_1218;
          uStack_e80 = uStack_1210;
          auVar31._8_8_ = uStack_1210;
          auVar31._0_8_ = local_1218;
          auVar7 = vcmpps_avx(auVar31,auVar5,1);
          local_1248._0_8_ = auVar7._0_8_;
          local_1248._8_8_ = auVar7._8_8_;
          local_e48 = 0x3f8000003f800000;
          uStack_e40 = 0x3f8000003f800000;
          local_e38 = local_1248._0_8_;
          uStack_e30 = local_1248._8_8_;
          auVar33._8_8_ = 0x3f8000003f800000;
          auVar33._0_8_ = 0x3f8000003f800000;
          local_1248 = vpand_avx(auVar7,auVar33);
          local_f38 = local_1208;
          uStack_f30 = uStack_1200;
          local_f48 = local_1248._0_8_;
          uStack_f40 = local_1248._8_8_;
          _local_1218 = vsubps_avx(auVar5,local_1248);
          local_df8 = local_1218;
          local_de8 = ::_ps_cephes_exp_C1;
          local_11d8 = local_11f8;
          local_c88 = local_1218;
          uStack_c80 = uStack_1210;
          local_c98[0] = 0.6933594;
          local_c98[1] = 0.6933594;
          afStack_c90[0] = 0.6933594;
          afStack_c90[1] = 0.6933594;
          local_ca8 = local_11f8._0_8_;
          uStack_ca0 = local_11f8._8_8_;
          auVar41._8_4_ = 0.6933594;
          auVar41._12_4_ = 0.6933594;
          auVar41._0_4_ = 0.6933594;
          auVar41._4_4_ = 0.6933594;
          auVar7 = vfnmadd213ps_fma(auVar41,_local_1218,auVar6);
          local_e00 = ::_ps_cephes_exp_C2;
          local_c58 = local_1218;
          uStack_c50 = uStack_1210;
          local_c68[0] = -0.00021219444;
          local_c68[1] = -0.00021219444;
          afStack_c60[0] = -0.00021219444;
          afStack_c60[1] = -0.00021219444;
          local_11f8._0_8_ = auVar7._0_8_;
          local_c78 = local_11f8._0_8_;
          local_11f8._8_8_ = auVar7._8_8_;
          uStack_c70 = local_11f8._8_8_;
          auVar42._8_4_ = -0.00021219444;
          auVar42._12_4_ = -0.00021219444;
          auVar42._0_4_ = -0.00021219444;
          auVar42._4_4_ = -0.00021219444;
          local_11f8 = vfnmadd213ps_fma(auVar42,_local_1218,auVar7);
          local_1118 = local_11f8._0_8_;
          uVar88 = local_1118;
          uStack_1110 = local_11f8._8_8_;
          uVar89 = uStack_1110;
          local_1128 = local_11f8._0_8_;
          uStack_1120 = local_11f8._8_8_;
          local_1118._0_4_ = local_11f8._0_4_;
          local_1118._4_4_ = local_11f8._4_4_;
          uStack_1110._0_4_ = local_11f8._8_4_;
          uStack_1110._4_4_ = local_11f8._12_4_;
          local_1208._4_4_ = local_1118._4_4_ * local_1118._4_4_;
          local_1208._0_4_ = (float)local_1118 * (float)local_1118;
          uStack_1200._0_4_ = (float)uStack_1110 * (float)uStack_1110;
          uStack_1200._4_4_ = uStack_1110._4_4_ * uStack_1110._4_4_;
          uStack_1250._0_4_ = 0x39506967;
          local_1258 = (undefined1  [8])0x3950696739506967;
          uStack_1250._4_4_ = 0x39506967;
          local_11c8 = local_1258;
          local_1160 = ::_ps_cephes_exp_p1;
          local_10c8 = 0x3950696739506967;
          uStack_10c0 = uStack_1250;
          local_10d8 = local_11f8._0_8_;
          uStack_10d0 = local_11f8._8_8_;
          local_10e8[0] = 0.0013981999;
          local_10e8[1] = 0.0013981999;
          afStack_10e0[0] = 0.0013981999;
          afStack_10e0[1] = 0.0013981999;
          auVar22._8_4_ = 0.0013981999;
          auVar22._12_4_ = 0.0013981999;
          auVar22._0_4_ = 0.0013981999;
          auVar22._4_4_ = 0.0013981999;
          auVar7 = vfmadd213ps_fma(local_11f8,_local_1258,auVar22);
          local_1178 = ::_ps_cephes_exp_p2;
          local_1258 = auVar7._0_8_;
          local_1098 = local_1258;
          uStack_1250 = auVar7._8_8_;
          uStack_1090 = uStack_1250;
          local_10a8 = local_11f8._0_8_;
          uStack_10a0 = local_11f8._8_8_;
          local_10b8[0] = 0.008333452;
          local_10b8[1] = 0.008333452;
          afStack_10b0[0] = 0.008333452;
          afStack_10b0[1] = 0.008333452;
          auVar23._8_4_ = 0.008333452;
          auVar23._12_4_ = 0.008333452;
          auVar23._0_4_ = 0.008333452;
          auVar23._4_4_ = 0.008333452;
          auVar7 = vfmadd213ps_fma(local_11f8,auVar7,auVar23);
          local_1190 = ::_ps_cephes_exp_p3;
          local_1258 = auVar7._0_8_;
          local_1068 = local_1258;
          uStack_1250 = auVar7._8_8_;
          uStack_1060 = uStack_1250;
          local_1078 = local_11f8._0_8_;
          uStack_1070 = local_11f8._8_8_;
          local_1088[0] = 0.041665796;
          local_1088[1] = 0.041665796;
          afStack_1080[0] = 0.041665796;
          afStack_1080[1] = 0.041665796;
          auVar24._8_4_ = 0.041665796;
          auVar24._12_4_ = 0.041665796;
          auVar24._0_4_ = 0.041665796;
          auVar24._4_4_ = 0.041665796;
          auVar7 = vfmadd213ps_fma(local_11f8,auVar7,auVar24);
          local_11a8 = ::_ps_cephes_exp_p4;
          local_1258 = auVar7._0_8_;
          local_1038 = local_1258;
          uStack_1250 = auVar7._8_8_;
          uStack_1030 = uStack_1250;
          local_1048 = local_11f8._0_8_;
          uStack_1040 = local_11f8._8_8_;
          local_1058[0] = 0.16666666;
          local_1058[1] = 0.16666666;
          afStack_1050[0] = 0.16666666;
          afStack_1050[1] = 0.16666666;
          auVar25._8_4_ = 0.16666666;
          auVar25._12_4_ = 0.16666666;
          auVar25._0_4_ = 0.16666666;
          auVar25._4_4_ = 0.16666666;
          auVar7 = vfmadd213ps_fma(local_11f8,auVar7,auVar25);
          local_11c0 = ::_ps_cephes_exp_p5;
          local_1258 = auVar7._0_8_;
          local_1008 = local_1258;
          uStack_1250 = auVar7._8_8_;
          uStack_1000 = uStack_1250;
          local_1018 = local_11f8._0_8_;
          uStack_1010 = local_11f8._8_8_;
          local_1028[0] = 0.5;
          local_1028[1] = 0.5;
          afStack_1020[0] = 0.5;
          afStack_1020[1] = 0.5;
          auVar26._8_4_ = 0.5;
          auVar26._12_4_ = 0.5;
          auVar26._0_4_ = 0.5;
          auVar26._4_4_ = 0.5;
          auVar7 = vfmadd213ps_fma(local_11f8,auVar7,auVar26);
          local_11d0 = local_1208;
          local_1258 = auVar7._0_8_;
          local_fd8 = local_1258;
          uStack_1250 = auVar7._8_8_;
          uStack_fd0 = uStack_1250;
          local_fe8 = local_1208;
          uStack_fe0 = uStack_1200;
          local_ff8 = local_11f8._0_8_;
          uStack_ff0 = local_11f8._8_8_;
          auVar7 = vfmadd213ps_fma(_local_1208,auVar7,local_11f8);
          local_1258 = auVar7._0_8_;
          uStack_1250 = auVar7._8_8_;
          local_f88 = 0x3f8000003f800000;
          uStack_f80 = 0x3f8000003f800000;
          local_f78 = local_1258;
          uVar92 = local_f78;
          uStack_f70 = uStack_1250;
          uVar93 = uStack_f70;
          local_f78._0_4_ = auVar7._0_4_;
          local_f78._4_4_ = auVar7._4_4_;
          uStack_f70._0_4_ = auVar7._8_4_;
          uStack_f70._4_4_ = auVar7._12_4_;
          local_1258._4_4_ = local_f78._4_4_ + 1.0;
          local_1258._0_4_ = (float)local_f78 + 1.0;
          uStack_1250._0_4_ = (float)uStack_f70 + 1.0;
          uStack_1250._4_4_ = uStack_f70._4_4_ + 1.0;
          local_ee8 = local_1218;
          uVar94 = local_ee8;
          uStack_ee0 = uStack_1210;
          uVar95 = uStack_ee0;
          local_ee8._0_4_ = local_1218._0_4_;
          local_ee8._4_4_ = local_1218._4_4_;
          uStack_ee0._0_4_ = local_1218._8_4_;
          uStack_ee0._4_4_ = local_1218._12_4_;
          local_1228._4_4_ = (int)local_ee8._4_4_;
          local_1228._0_4_ = (int)(float)local_ee8;
          local_1228._8_4_ = (int)(float)uStack_ee0;
          local_1228._12_4_ = (int)uStack_ee0._4_4_;
          local_d98 = local_1228._0_8_;
          uStack_d90 = local_1228._8_8_;
          local_da8 = 0x7f0000007f;
          uStack_da0 = 0x7f0000007f;
          auVar36._8_8_ = local_1228._8_8_;
          auVar36._0_8_ = local_1228._0_8_;
          auVar35._8_8_ = 0x7f0000007f;
          auVar35._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar36,auVar35);
          local_1228._0_8_ = auVar7._0_8_;
          local_1228._8_8_ = auVar7._8_8_;
          local_d58 = local_1228._0_8_;
          uStack_d50 = local_1228._8_8_;
          local_d5c = 0x17;
          local_1228 = vpslld_avx(auVar7,ZEXT416(0x17));
          local_d28 = local_1228._0_8_;
          uStack_d20 = local_1228._8_8_;
          local_1268 = local_1228._0_8_;
          uStack_1260 = local_1228._8_8_;
          local_1138 = local_1258;
          uStack_1130 = uStack_1250;
          local_1148 = local_1228._0_8_;
          uVar8 = local_1148;
          uStack_1140 = local_1228._8_8_;
          uVar9 = uStack_1140;
          local_1148._0_4_ = local_1228._0_4_;
          local_1148._4_4_ = local_1228._4_4_;
          uStack_1140._0_4_ = local_1228._8_4_;
          uStack_1140._4_4_ = local_1228._12_4_;
          local_1258._0_4_ = ((float)local_f78 + 1.0) * (float)local_1148;
          local_1258._4_4_ = (local_f78._4_4_ + 1.0) * local_1148._4_4_;
          uStack_1140._0_4_ = ((float)uStack_f70 + 1.0) * (float)uStack_1140;
          uStack_1140._4_4_ = (uStack_f70._4_4_ + 1.0) * uStack_1140._4_4_;
          uStack_1250._0_4_ = (float)uStack_1140;
          uStack_1250._4_4_ = uStack_1140._4_4_;
          local_15e8 = local_1258;
          uStack_15e0 = uStack_1250;
          local_15a8 = (float)local_1258._0_4_ + 1.0;
          fStack_15a4 = (float)local_1258._4_4_ + 1.0;
          fStack_15a0 = (float)uStack_1140 + 1.0;
          fStack_159c = uStack_1140._4_4_ + 1.0;
          auVar14._4_4_ = fStack_15a4;
          auVar14._0_4_ = local_15a8;
          auVar14._8_4_ = fStack_15a0;
          auVar14._12_4_ = fStack_159c;
          _local_1a08 = vdivps_avx(local_15d8,auVar14);
          local_1598 = local_15d8;
          local_11b8 = local_11d8;
          local_11b0 = local_11c8;
          local_11a0 = local_11d8;
          local_1198 = local_11c8;
          local_1188 = local_11d8;
          local_1180 = local_11c8;
          local_1170 = local_11d8;
          local_1168 = local_11c8;
          local_1158 = local_11d8;
          local_1150 = local_11c8;
          local_1148 = uVar8;
          uStack_1140 = uVar9;
          local_1118 = uVar88;
          uStack_1110 = uVar89;
          local_10f8 = uVar90;
          uStack_10f0 = uVar91;
          local_f78 = uVar92;
          uStack_f70 = uVar93;
          local_ee8 = uVar94;
          uStack_ee0 = uVar95;
          local_e08 = local_11d8;
          local_df0 = local_11d8;
          local_de0 = local_df8;
          break;
        case 5:
          local_1768 = local_2498._0_8_;
          uStack_1760 = local_2498._8_8_;
          local_1508 = (undefined1  [16])0x0;
          local_1558 = 0x3f800000;
          uStack_1554 = 0x3f800000;
          uStack_1550 = 0x3f800000;
          uStack_154c = 0x3f800000;
          local_12b8 = local_2498._0_8_;
          uStack_12b0 = local_2498._8_8_;
          local_12c8 = 0x42b0c0a5;
          uStack_12c4 = 0x42b0c0a5;
          uStack_12c0 = 0x42b0c0a5;
          uStack_12bc = 0x42b0c0a5;
          auVar21._8_4_ = 0x42b0c0a5;
          auVar21._0_8_ = 0x42b0c0a542b0c0a5;
          auVar21._12_4_ = 0x42b0c0a5;
          auVar7 = vminps_avx(local_2498,auVar21);
          local_1518._0_8_ = auVar7._0_8_;
          local_1518._8_8_ = auVar7._8_8_;
          local_12d8 = local_1518._0_8_;
          uStack_12d0 = local_1518._8_8_;
          local_12e8 = 0xc2b0c0a5;
          uStack_12e4 = 0xc2b0c0a5;
          uStack_12e0 = 0xc2b0c0a5;
          uStack_12dc = 0xc2b0c0a5;
          auVar20._8_4_ = 0xc2b0c0a5;
          auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar20._12_4_ = 0xc2b0c0a5;
          auVar6 = vmaxps_avx(auVar7,auVar20);
          local_1518._0_8_ = auVar6._0_8_;
          local_1518._8_8_ = auVar6._8_8_;
          local_1418 = local_1518._0_8_;
          uVar90 = local_1418;
          uStack_1410 = local_1518._8_8_;
          uVar91 = uStack_1410;
          local_1428 = 0x3fb8aa3b;
          uStack_1424 = 0x3fb8aa3b;
          uStack_1420 = 0x3fb8aa3b;
          uStack_141c = 0x3fb8aa3b;
          local_1418._0_4_ = auVar6._0_4_;
          local_1418._4_4_ = auVar6._4_4_;
          uStack_1410._0_4_ = auVar6._8_4_;
          uStack_1410._4_4_ = auVar6._12_4_;
          local_1538._4_4_ = local_1418._4_4_ * 1.442695;
          local_1538._0_4_ = (float)local_1418 * 1.442695;
          uStack_1530._0_4_ = (float)uStack_1410 * 1.442695;
          uStack_1530._4_4_ = uStack_1410._4_4_ * 1.442695;
          local_1278 = local_1538;
          uStack_1270 = uStack_1530;
          local_1288 = 0x3f000000;
          uStack_1284 = 0x3f000000;
          uStack_1280 = 0x3f000000;
          uStack_127c = 0x3f000000;
          local_1538._0_4_ = (float)local_1418 * 1.442695 + 0.5;
          local_1538._4_4_ = local_1418._4_4_ * 1.442695 + 0.5;
          fVar120 = (float)uStack_1410 * 1.442695 + 0.5;
          fVar121 = uStack_1410._4_4_ * 1.442695 + 0.5;
          uStack_1530._0_4_ = fVar120;
          uStack_1530._4_4_ = fVar121;
          local_eb8 = local_1538;
          uStack_eb0 = uStack_1530;
          local_1548._4_4_ = (int)(float)local_1538._4_4_;
          local_1548._0_4_ = (int)(float)local_1538._0_4_;
          local_1548._8_4_ = (int)fVar120;
          local_1548._12_4_ = (int)fVar121;
          local_e98 = local_1548._0_8_;
          uStack_e90 = local_1548._8_8_;
          auVar30._8_8_ = local_1548._8_8_;
          auVar30._0_8_ = local_1548._0_8_;
          auVar5 = vcvtdq2ps_avx(auVar30);
          local_1528 = auVar5._0_8_;
          uStack_1520 = auVar5._8_8_;
          local_e58 = local_1528;
          uStack_e50 = uStack_1520;
          local_e68 = local_1538;
          uStack_e60 = uStack_1530;
          auVar32._8_8_ = uStack_1530;
          auVar32._0_8_ = local_1538;
          auVar7 = vcmpps_avx(auVar32,auVar5,1);
          local_1568._0_8_ = auVar7._0_8_;
          local_1568._8_8_ = auVar7._8_8_;
          local_e28 = 0x3f8000003f800000;
          uStack_e20 = 0x3f8000003f800000;
          local_e18 = local_1568._0_8_;
          uStack_e10 = local_1568._8_8_;
          auVar34._8_8_ = 0x3f8000003f800000;
          auVar34._0_8_ = 0x3f8000003f800000;
          local_1568 = vpand_avx(auVar7,auVar34);
          local_f18 = local_1528;
          uStack_f10 = uStack_1520;
          local_f28 = local_1568._0_8_;
          uStack_f20 = local_1568._8_8_;
          _local_1538 = vsubps_avx(auVar5,local_1568);
          local_dc8 = local_1538;
          local_db8 = ::_ps_cephes_exp_C1;
          local_14f8 = local_1518;
          local_ce8 = local_1538;
          uStack_ce0 = uStack_1530;
          local_cf8[0] = 0.6933594;
          local_cf8[1] = 0.6933594;
          afStack_cf0[0] = 0.6933594;
          afStack_cf0[1] = 0.6933594;
          local_d08 = local_1518._0_8_;
          uStack_d00 = local_1518._8_8_;
          auVar39._8_4_ = 0.6933594;
          auVar39._12_4_ = 0.6933594;
          auVar39._0_4_ = 0.6933594;
          auVar39._4_4_ = 0.6933594;
          auVar7 = vfnmadd213ps_fma(auVar39,_local_1538,auVar6);
          local_dd0 = ::_ps_cephes_exp_C2;
          local_cb8 = local_1538;
          uStack_cb0 = uStack_1530;
          local_cc8[0] = -0.00021219444;
          local_cc8[1] = -0.00021219444;
          afStack_cc0[0] = -0.00021219444;
          afStack_cc0[1] = -0.00021219444;
          local_1518._0_8_ = auVar7._0_8_;
          local_cd8 = local_1518._0_8_;
          local_1518._8_8_ = auVar7._8_8_;
          uStack_cd0 = local_1518._8_8_;
          auVar40._8_4_ = -0.00021219444;
          auVar40._12_4_ = -0.00021219444;
          auVar40._0_4_ = -0.00021219444;
          auVar40._4_4_ = -0.00021219444;
          local_1518 = vfnmadd213ps_fma(auVar40,_local_1538,auVar7);
          local_1438 = local_1518._0_8_;
          uVar88 = local_1438;
          uStack_1430 = local_1518._8_8_;
          uVar89 = uStack_1430;
          local_1448 = local_1518._0_8_;
          uStack_1440 = local_1518._8_8_;
          local_1438._0_4_ = local_1518._0_4_;
          local_1438._4_4_ = local_1518._4_4_;
          uStack_1430._0_4_ = local_1518._8_4_;
          uStack_1430._4_4_ = local_1518._12_4_;
          local_1528._4_4_ = local_1438._4_4_ * local_1438._4_4_;
          local_1528._0_4_ = (float)local_1438 * (float)local_1438;
          uStack_1520._0_4_ = (float)uStack_1430 * (float)uStack_1430;
          uStack_1520._4_4_ = uStack_1430._4_4_ * uStack_1430._4_4_;
          uStack_1570._0_4_ = 0x39506967;
          local_1578 = (undefined1  [8])0x3950696739506967;
          uStack_1570._4_4_ = 0x39506967;
          local_14e8 = local_1578;
          local_1480 = ::_ps_cephes_exp_p1;
          local_13e8 = 0x3950696739506967;
          uStack_13e0 = uStack_1570;
          local_13f8 = local_1518._0_8_;
          uStack_13f0 = local_1518._8_8_;
          local_1408[0] = 0.0013981999;
          local_1408[1] = 0.0013981999;
          afStack_1400[0] = 0.0013981999;
          afStack_1400[1] = 0.0013981999;
          auVar15._8_4_ = 0.0013981999;
          auVar15._12_4_ = 0.0013981999;
          auVar15._0_4_ = 0.0013981999;
          auVar15._4_4_ = 0.0013981999;
          auVar7 = vfmadd213ps_fma(local_1518,_local_1578,auVar15);
          local_1498 = ::_ps_cephes_exp_p2;
          local_1578 = auVar7._0_8_;
          local_13b8 = local_1578;
          uStack_1570 = auVar7._8_8_;
          uStack_13b0 = uStack_1570;
          local_13c8 = local_1518._0_8_;
          uStack_13c0 = local_1518._8_8_;
          local_13d8[0] = 0.008333452;
          local_13d8[1] = 0.008333452;
          afStack_13d0[0] = 0.008333452;
          afStack_13d0[1] = 0.008333452;
          auVar16._8_4_ = 0.008333452;
          auVar16._12_4_ = 0.008333452;
          auVar16._0_4_ = 0.008333452;
          auVar16._4_4_ = 0.008333452;
          auVar7 = vfmadd213ps_fma(local_1518,auVar7,auVar16);
          local_14b0 = ::_ps_cephes_exp_p3;
          local_1578 = auVar7._0_8_;
          local_1388 = local_1578;
          uStack_1570 = auVar7._8_8_;
          uStack_1380 = uStack_1570;
          local_1398 = local_1518._0_8_;
          uStack_1390 = local_1518._8_8_;
          local_13a8[0] = 0.041665796;
          local_13a8[1] = 0.041665796;
          afStack_13a0[0] = 0.041665796;
          afStack_13a0[1] = 0.041665796;
          auVar17._8_4_ = 0.041665796;
          auVar17._12_4_ = 0.041665796;
          auVar17._0_4_ = 0.041665796;
          auVar17._4_4_ = 0.041665796;
          auVar7 = vfmadd213ps_fma(local_1518,auVar7,auVar17);
          local_14c8 = ::_ps_cephes_exp_p4;
          local_1578 = auVar7._0_8_;
          local_1358 = local_1578;
          uStack_1570 = auVar7._8_8_;
          uStack_1350 = uStack_1570;
          local_1368 = local_1518._0_8_;
          uStack_1360 = local_1518._8_8_;
          local_1378[0] = 0.16666666;
          local_1378[1] = 0.16666666;
          afStack_1370[0] = 0.16666666;
          afStack_1370[1] = 0.16666666;
          auVar18._8_4_ = 0.16666666;
          auVar18._12_4_ = 0.16666666;
          auVar18._0_4_ = 0.16666666;
          auVar18._4_4_ = 0.16666666;
          auVar7 = vfmadd213ps_fma(local_1518,auVar7,auVar18);
          local_14e0 = ::_ps_cephes_exp_p5;
          local_1578 = auVar7._0_8_;
          local_1328 = local_1578;
          uStack_1570 = auVar7._8_8_;
          uStack_1320 = uStack_1570;
          local_1338 = local_1518._0_8_;
          uStack_1330 = local_1518._8_8_;
          local_1348[0] = 0.5;
          local_1348[1] = 0.5;
          afStack_1340[0] = 0.5;
          afStack_1340[1] = 0.5;
          auVar19._8_4_ = 0.5;
          auVar19._12_4_ = 0.5;
          auVar19._0_4_ = 0.5;
          auVar19._4_4_ = 0.5;
          auVar7 = vfmadd213ps_fma(local_1518,auVar7,auVar19);
          local_14f0 = local_1528;
          local_1578 = auVar7._0_8_;
          local_12f8 = local_1578;
          uStack_1570 = auVar7._8_8_;
          uStack_12f0 = uStack_1570;
          local_1308 = local_1528;
          uStack_1300 = uStack_1520;
          local_1318 = local_1518._0_8_;
          uStack_1310 = local_1518._8_8_;
          auVar7 = vfmadd213ps_fma(_local_1528,auVar7,local_1518);
          local_1578 = auVar7._0_8_;
          uStack_1570 = auVar7._8_8_;
          local_12a8 = 0x3f8000003f800000;
          uStack_12a0 = 0x3f8000003f800000;
          local_1298 = local_1578;
          uVar92 = local_1298;
          uStack_1290 = uStack_1570;
          uVar93 = uStack_1290;
          local_1298._0_4_ = auVar7._0_4_;
          local_1298._4_4_ = auVar7._4_4_;
          uStack_1290._0_4_ = auVar7._8_4_;
          uStack_1290._4_4_ = auVar7._12_4_;
          local_1578._4_4_ = local_1298._4_4_ + 1.0;
          local_1578._0_4_ = (float)local_1298 + 1.0;
          uStack_1570._0_4_ = (float)uStack_1290 + 1.0;
          uStack_1570._4_4_ = uStack_1290._4_4_ + 1.0;
          local_ec8 = local_1538;
          uVar94 = local_ec8;
          uStack_ec0 = uStack_1530;
          uVar95 = uStack_ec0;
          local_ec8._0_4_ = local_1538._0_4_;
          local_ec8._4_4_ = local_1538._4_4_;
          uStack_ec0._0_4_ = local_1538._8_4_;
          uStack_ec0._4_4_ = local_1538._12_4_;
          local_1548._4_4_ = (int)local_ec8._4_4_;
          local_1548._0_4_ = (int)(float)local_ec8;
          local_1548._8_4_ = (int)(float)uStack_ec0;
          local_1548._12_4_ = (int)uStack_ec0._4_4_;
          local_d78 = local_1548._0_8_;
          uStack_d70 = local_1548._8_8_;
          local_d88 = 0x7f0000007f;
          uStack_d80 = 0x7f0000007f;
          auVar38._8_8_ = local_1548._8_8_;
          auVar38._0_8_ = local_1548._0_8_;
          auVar37._8_8_ = 0x7f0000007f;
          auVar37._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar38,auVar37);
          local_1548._0_8_ = auVar7._0_8_;
          local_1548._8_8_ = auVar7._8_8_;
          local_d38 = local_1548._0_8_;
          uStack_d30 = local_1548._8_8_;
          local_d3c = 0x17;
          local_1548 = vpslld_avx(auVar7,ZEXT416(0x17));
          local_d18 = local_1548._0_8_;
          uStack_d10 = local_1548._8_8_;
          local_1588 = local_1548._0_8_;
          uStack_1580 = local_1548._8_8_;
          local_1458 = local_1578;
          uStack_1450 = uStack_1570;
          local_1468 = local_1548._0_8_;
          uVar8 = local_1468;
          uStack_1460 = local_1548._8_8_;
          uVar9 = uStack_1460;
          local_1468._0_4_ = local_1548._0_4_;
          local_1468._4_4_ = local_1548._4_4_;
          uStack_1460._0_4_ = local_1548._8_4_;
          uStack_1460._4_4_ = local_1548._12_4_;
          local_1578._0_4_ = ((float)local_1298 + 1.0) * (float)local_1468;
          local_1578._4_4_ = (local_1298._4_4_ + 1.0) * local_1468._4_4_;
          uStack_1460._0_4_ = ((float)uStack_1290 + 1.0) * (float)uStack_1460;
          uStack_1460._4_4_ = (uStack_1290._4_4_ + 1.0) * uStack_1460._4_4_;
          uStack_1570._0_4_ = (float)uStack_1460;
          uStack_1570._4_4_ = uStack_1460._4_4_;
          local_173c = 0x3f800000;
          local_1758 = 0x3f800000;
          uStack_1754 = 0x3f800000;
          uStack_1750 = 0x3f800000;
          uStack_174c = 0x3f800000;
          local_1608 = 0x3f8000003f800000;
          uStack_1600 = 0x3f8000003f800000;
          local_15f8 = local_1578;
          uStack_15f0 = uStack_1570;
          local_5b8._4_4_ = (float)local_1578._4_4_ + 1.0;
          local_5b8._0_4_ = (float)local_1578._0_4_ + 1.0;
          uStack_5b0._0_4_ = (float)uStack_1460 + 1.0;
          uStack_5b0._4_4_ = uStack_1460._4_4_ + 1.0;
          local_5d8 = 0x3f800000;
          uStack_5d4 = 0x3f800000;
          uStack_5d0 = 0x3f800000;
          uStack_5cc = 0x3f800000;
          local_5a8 = (undefined1  [16])0x0;
          local_d8 = local_5b8;
          uStack_d0 = uStack_5b0;
          local_e8 = 0;
          uStack_e0 = 0;
          auVar78._8_8_ = uStack_5b0;
          auVar78._0_8_ = local_5b8;
          local_5e8 = vcmpps_avx(auVar78,ZEXT816(0),2);
          local_258 = local_5b8;
          uStack_250 = uStack_5b0;
          local_268 = 0x800000;
          uStack_264 = 0x800000;
          uStack_260 = 0x800000;
          uStack_25c = 0x800000;
          auVar72._8_8_ = uStack_5b0;
          auVar72._0_8_ = local_5b8;
          auVar71._8_4_ = 0x800000;
          auVar71._0_8_ = 0x80000000800000;
          auVar71._12_4_ = 0x800000;
          auVar7 = vmaxps_avx(auVar72,auVar71);
          local_5b8 = auVar7._0_8_;
          uStack_5b0 = auVar7._8_8_;
          local_a8 = local_5b8;
          uStack_a0 = uStack_5b0;
          local_b8 = local_5b8;
          uStack_b0 = uStack_5b0;
          local_bc = 0x17;
          auVar6 = vpsrld_avx(auVar7,ZEXT416(0x17));
          local_148 = local_5b8;
          uStack_140 = uStack_5b0;
          local_158 = 0x807fffff;
          uStack_154 = 0x807fffff;
          uStack_150 = 0x807fffff;
          uStack_14c = 0x807fffff;
          auVar76._8_4_ = 0x807fffff;
          auVar76._0_8_ = 0x807fffff807fffff;
          auVar76._12_4_ = 0x807fffff;
          auVar7 = vpand_avx(auVar7,auVar76);
          local_5b8 = auVar7._0_8_;
          uStack_5b0 = auVar7._8_8_;
          local_68 = local_5b8;
          uStack_60 = uStack_5b0;
          local_78 = 0x3f000000;
          uStack_74 = 0x3f000000;
          uStack_70 = 0x3f000000;
          uStack_6c = 0x3f000000;
          auVar79._8_4_ = 0x3f000000;
          auVar79._0_8_ = 0x3f0000003f000000;
          auVar79._12_4_ = 0x3f000000;
          auVar5 = vpor_avx(auVar7,auVar79);
          local_5c8._0_8_ = auVar6._0_8_;
          local_5c8._8_8_ = auVar6._8_8_;
          local_48 = local_5c8._0_8_;
          uStack_40 = local_5c8._8_8_;
          local_58 = 0x7f0000007f;
          uStack_50 = 0x7f0000007f;
          auVar80._8_8_ = 0x7f0000007f;
          auVar80._0_8_ = 0x7f0000007f;
          local_5c8 = vpsubd_avx(auVar6,auVar80);
          local_1a8 = local_5c8._0_8_;
          uStack_1a0 = local_5c8._8_8_;
          auVar7 = vcvtdq2ps_avx(local_5c8);
          local_5f8 = auVar7._0_8_;
          uStack_5f0 = auVar7._8_8_;
          local_208 = 0x3f8000003f800000;
          uStack_200 = 0x3f8000003f800000;
          local_1f8 = local_5f8;
          uVar116 = local_1f8;
          uStack_1f0 = uStack_5f0;
          uVar117 = uStack_1f0;
          local_1f8._0_4_ = auVar7._0_4_;
          local_1f8._4_4_ = auVar7._4_4_;
          uStack_1f0._0_4_ = auVar7._8_4_;
          uStack_1f0._4_4_ = auVar7._12_4_;
          local_5f8._4_4_ = local_1f8._4_4_ + 1.0;
          local_5f8._0_4_ = (float)local_1f8 + 1.0;
          uStack_5f0._0_4_ = (float)uStack_1f0 + 1.0;
          uStack_5f0._4_4_ = uStack_1f0._4_4_ + 1.0;
          local_5b8 = auVar5._0_8_;
          uStack_5b0 = auVar5._8_8_;
          local_28 = local_5b8;
          uStack_20 = uStack_5b0;
          local_38 = 0x3f3504f3;
          uStack_34 = 0x3f3504f3;
          uStack_30 = 0x3f3504f3;
          uStack_2c = 0x3f3504f3;
          auVar81._8_4_ = 0x3f3504f3;
          auVar81._0_8_ = 0x3f3504f33f3504f3;
          auVar81._12_4_ = 0x3f3504f3;
          local_608 = vcmpps_avx(auVar5,auVar81,1);
          local_168 = local_5b8;
          uStack_160 = uStack_5b0;
          local_178 = local_608._0_8_;
          uStack_170 = local_608._8_8_;
          local_618 = vpand_avx(auVar5,local_608);
          local_1c8 = 0x3f8000003f800000;
          uStack_1c0 = 0x3f8000003f800000;
          local_1b8 = local_5b8;
          uStack_1b0 = uStack_5b0;
          auVar74._8_8_ = 0x3f8000003f800000;
          auVar74._0_8_ = 0x3f8000003f800000;
          auVar7 = vsubps_avx(auVar5,auVar74);
          local_188 = 0x3f8000003f800000;
          uStack_180 = 0x3f8000003f800000;
          local_198 = local_608._0_8_;
          uStack_190 = local_608._8_8_;
          auVar75._8_8_ = 0x3f8000003f800000;
          auVar75._0_8_ = 0x3f8000003f800000;
          local_1e8 = vpand_avx(local_608,auVar75);
          local_1d8 = local_5f8;
          uStack_1d0 = uStack_5f0;
          auVar73._8_8_ = uStack_5f0;
          auVar73._0_8_ = local_5f8;
          _local_5f8 = vsubps_avx(auVar73,local_1e8);
          local_5b8 = auVar7._0_8_;
          uStack_5b0 = auVar7._8_8_;
          local_218 = local_5b8;
          uVar114 = local_218;
          uStack_210 = uStack_5b0;
          uVar115 = uStack_210;
          local_228 = local_618._0_8_;
          uVar112 = local_228;
          uStack_220 = local_618._8_8_;
          uVar113 = uStack_220;
          local_218._0_4_ = auVar7._0_4_;
          local_218._4_4_ = auVar7._4_4_;
          uStack_210._0_4_ = auVar7._8_4_;
          uStack_210._4_4_ = auVar7._12_4_;
          local_228._0_4_ = local_618._0_4_;
          local_228._4_4_ = local_618._4_4_;
          uStack_220._0_4_ = local_618._8_4_;
          uStack_220._4_4_ = local_618._12_4_;
          local_5b8._0_4_ = (float)local_218 + (float)local_228;
          local_5b8._4_4_ = local_218._4_4_ + local_228._4_4_;
          uStack_210._0_4_ = (float)uStack_210 + (float)uStack_220;
          uStack_210._4_4_ = uStack_210._4_4_ + uStack_220._4_4_;
          uStack_5b0._0_4_ = (float)uStack_210;
          uStack_5b0._4_4_ = uStack_210._4_4_;
          local_458 = local_5b8;
          uStack_450 = uStack_5b0;
          local_468 = local_5b8;
          uStack_460 = uStack_5b0;
          local_628 = (float)local_5b8._0_4_ * (float)local_5b8._0_4_;
          fStack_624 = (float)local_5b8._4_4_ * (float)local_5b8._4_4_;
          fStack_620 = (float)uStack_210 * (float)uStack_210;
          fStack_61c = uStack_210._4_4_ * uStack_210._4_4_;
          uStack_630._0_4_ = 0x3d9021bb;
          local_638 = (undefined1  [8])0x3d9021bb3d9021bb;
          uStack_630._4_4_ = 0x3d9021bb;
          local_580 = local_638;
          local_598 = local_5b8;
          local_4c0 = ::_ps_cephes_log_p1;
          local_428 = 0x3d9021bb3d9021bb;
          uStack_420 = uStack_630;
          local_438 = local_5b8;
          uStack_430 = uStack_5b0;
          local_448[0] = -0.1151461;
          local_448[1] = -0.1151461;
          afStack_440[0] = -0.1151461;
          afStack_440[1] = -0.1151461;
          auVar61._8_4_ = -0.1151461;
          auVar61._12_4_ = -0.1151461;
          auVar61._0_4_ = -0.1151461;
          auVar61._4_4_ = -0.1151461;
          auVar7 = vfmadd213ps_fma(_local_5b8,_local_638,auVar61);
          local_4d8 = ::_ps_cephes_log_p2;
          local_638 = auVar7._0_8_;
          local_3f8 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_3f0 = uStack_630;
          local_408 = local_5b8;
          uStack_400 = uStack_5b0;
          local_418[0] = 0.116769984;
          local_418[1] = 0.116769984;
          afStack_410[0] = 0.116769984;
          afStack_410[1] = 0.116769984;
          auVar62._8_4_ = 0.116769984;
          auVar62._12_4_ = 0.116769984;
          auVar62._0_4_ = 0.116769984;
          auVar62._4_4_ = 0.116769984;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar62);
          local_4f0 = ::_ps_cephes_log_p3;
          local_638 = auVar7._0_8_;
          local_3c8 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_3c0 = uStack_630;
          local_3d8 = local_5b8;
          uStack_3d0 = uStack_5b0;
          local_3e8[0] = -0.12420141;
          local_3e8[1] = -0.12420141;
          afStack_3e0[0] = -0.12420141;
          afStack_3e0[1] = -0.12420141;
          auVar63._8_4_ = -0.12420141;
          auVar63._12_4_ = -0.12420141;
          auVar63._0_4_ = -0.12420141;
          auVar63._4_4_ = -0.12420141;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar63);
          local_508 = ::_ps_cephes_log_p4;
          local_638 = auVar7._0_8_;
          local_398 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_390 = uStack_630;
          local_3a8 = local_5b8;
          uStack_3a0 = uStack_5b0;
          local_3b8[0] = 0.14249323;
          local_3b8[1] = 0.14249323;
          afStack_3b0[0] = 0.14249323;
          afStack_3b0[1] = 0.14249323;
          auVar64._8_4_ = 0.14249323;
          auVar64._12_4_ = 0.14249323;
          auVar64._0_4_ = 0.14249323;
          auVar64._4_4_ = 0.14249323;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar64);
          local_520 = ::_ps_cephes_log_p5;
          local_638 = auVar7._0_8_;
          local_368 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_360 = uStack_630;
          local_378 = local_5b8;
          uStack_370 = uStack_5b0;
          local_388[0] = -0.16668057;
          local_388[1] = -0.16668057;
          afStack_380[0] = -0.16668057;
          afStack_380[1] = -0.16668057;
          auVar65._8_4_ = -0.16668057;
          auVar65._12_4_ = -0.16668057;
          auVar65._0_4_ = -0.16668057;
          auVar65._4_4_ = -0.16668057;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar65);
          local_538 = ::_ps_cephes_log_p6;
          local_638 = auVar7._0_8_;
          local_338 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_330 = uStack_630;
          local_348 = local_5b8;
          uStack_340 = uStack_5b0;
          local_358[0] = 0.20000714;
          local_358[1] = 0.20000714;
          afStack_350[0] = 0.20000714;
          afStack_350[1] = 0.20000714;
          auVar66._8_4_ = 0.20000714;
          auVar66._12_4_ = 0.20000714;
          auVar66._0_4_ = 0.20000714;
          auVar66._4_4_ = 0.20000714;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar66);
          local_550 = ::_ps_cephes_log_p7;
          local_638 = auVar7._0_8_;
          local_308 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_300 = uStack_630;
          local_318 = local_5b8;
          uStack_310 = uStack_5b0;
          local_328[0] = -0.24999994;
          local_328[1] = -0.24999994;
          afStack_320[0] = -0.24999994;
          afStack_320[1] = -0.24999994;
          auVar67._8_4_ = -0.24999994;
          auVar67._12_4_ = -0.24999994;
          auVar67._0_4_ = -0.24999994;
          auVar67._4_4_ = -0.24999994;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar67);
          local_568 = ::_ps_cephes_log_p8;
          local_638 = auVar7._0_8_;
          local_2d8 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_2d0 = uStack_630;
          local_2e8 = local_5b8;
          uStack_2e0 = uStack_5b0;
          local_2f8[0] = 0.3333333;
          local_2f8[1] = 0.3333333;
          afStack_2f0[0] = 0.3333333;
          afStack_2f0[1] = 0.3333333;
          auVar68._8_4_ = 0.3333333;
          auVar68._12_4_ = 0.3333333;
          auVar68._0_4_ = 0.3333333;
          auVar68._4_4_ = 0.3333333;
          auVar7 = vfmadd213ps_fma(_local_5b8,auVar7,auVar68);
          local_638 = auVar7._0_8_;
          uStack_630 = auVar7._8_8_;
          local_478 = local_638;
          uVar108 = local_478;
          uStack_470 = uStack_630;
          uVar109 = uStack_470;
          local_488 = local_5b8;
          uStack_480 = uStack_5b0;
          local_478._0_4_ = auVar7._0_4_;
          local_478._4_4_ = auVar7._4_4_;
          uStack_470._0_4_ = auVar7._8_4_;
          uStack_470._4_4_ = auVar7._12_4_;
          local_638._4_4_ = local_478._4_4_ * (float)local_5b8._4_4_;
          local_638._0_4_ = (float)local_478 * (float)local_5b8._0_4_;
          uStack_630._0_4_ = (float)uStack_470 * (float)uStack_210;
          uStack_630._4_4_ = uStack_470._4_4_ * uStack_210._4_4_;
          local_4a8 = CONCAT44(fStack_624,local_628);
          uStack_4a0 = CONCAT44(fStack_61c,fStack_620);
          local_498 = local_638;
          uStack_490 = uStack_630;
          local_638._4_4_ = local_478._4_4_ * (float)local_5b8._4_4_ * fStack_624;
          local_638._0_4_ = (float)local_478 * (float)local_5b8._0_4_ * local_628;
          uStack_630._0_4_ = (float)uStack_470 * (float)uStack_210 * fStack_620;
          uStack_630._4_4_ = uStack_470._4_4_ * uStack_210._4_4_ * fStack_61c;
          local_588 = local_5f8;
          local_578 = ::_ps_cephes_log_q1;
          local_2a8 = local_5f8;
          uStack_2a0 = uStack_5f0;
          local_2b8[0] = -0.00021219444;
          local_2b8[1] = -0.00021219444;
          afStack_2b0[0] = -0.00021219444;
          afStack_2b0[1] = -0.00021219444;
          local_2c8 = local_638;
          uStack_2c0 = uStack_630;
          auVar69._8_4_ = -0.00021219444;
          auVar69._12_4_ = -0.00021219444;
          auVar69._0_4_ = -0.00021219444;
          auVar69._4_4_ = -0.00021219444;
          auVar7 = vfmadd213ps_fma(auVar69,_local_5f8,_local_638);
          local_120 = &local_628;
          local_128 = ::_ps_0p5;
          local_f8 = CONCAT44(fStack_624,local_628);
          uStack_f0 = CONCAT44(fStack_61c,fStack_620);
          auVar83._4_4_ = fStack_624;
          auVar83._0_4_ = local_628;
          auVar83._8_4_ = fStack_620;
          auVar83._12_4_ = fStack_61c;
          local_108[0] = 0.5;
          local_108[1] = 0.5;
          afStack_100[0] = 0.5;
          afStack_100[1] = 0.5;
          local_638 = auVar7._0_8_;
          local_118 = local_638;
          uStack_630 = auVar7._8_8_;
          uStack_110 = uStack_630;
          auVar77._8_4_ = 0.5;
          auVar77._12_4_ = 0.5;
          auVar77._0_4_ = 0.5;
          auVar77._4_4_ = 0.5;
          _local_638 = vfnmadd213ps_fma(auVar77,auVar83,auVar7);
          local_238 = local_5b8;
          uStack_230 = uStack_5b0;
          local_248 = local_638;
          uVar110 = local_248;
          uStack_240 = uStack_630;
          uVar111 = uStack_240;
          local_248._0_4_ = local_638._0_4_;
          local_248._4_4_ = local_638._4_4_;
          uStack_240._0_4_ = local_638._8_4_;
          uStack_240._4_4_ = local_638._12_4_;
          local_5b8._4_4_ = (float)local_5b8._4_4_ + local_248._4_4_;
          local_5b8._0_4_ = (float)local_5b8._0_4_ + (float)local_248;
          uStack_5b0._0_4_ = (float)uStack_210 + (float)uStack_240;
          uStack_5b0._4_4_ = uStack_210._4_4_ + uStack_240._4_4_;
          local_590 = ::_ps_cephes_log_q2;
          local_278 = local_5f8;
          uStack_270 = uStack_5f0;
          local_288[0] = 0.6933594;
          local_288[1] = 0.6933594;
          afStack_280[0] = 0.6933594;
          afStack_280[1] = 0.6933594;
          local_298 = local_5b8;
          uStack_290 = uStack_5b0;
          auVar70._8_4_ = 0.6933594;
          auVar70._12_4_ = 0.6933594;
          auVar70._0_4_ = 0.6933594;
          auVar70._4_4_ = 0.6933594;
          auVar7 = vfmadd213ps_fma(auVar70,_local_5f8,_local_5b8);
          local_5b8 = auVar7._0_8_;
          uStack_5b0 = auVar7._8_8_;
          local_88 = local_5b8;
          uStack_80 = uStack_5b0;
          local_98 = local_5e8._0_8_;
          uStack_90 = local_5e8._8_8_;
          _local_5b8 = vpor_avx(auVar7,local_5e8);
          local_c28 = local_5b8;
          uStack_c20 = uStack_5b0;
          local_bdc = 0x3f800000;
          local_bf8 = 0x3f800000;
          uStack_bf4 = 0x3f800000;
          uStack_bf0 = 0x3f800000;
          uStack_bec = 0x3f800000;
          local_c38 = 0x3f8000003f800000;
          uStack_c30 = 0x3f8000003f800000;
          local_bfc = 0x40000000;
          local_c18 = 0x40000000;
          uStack_c14 = 0x40000000;
          uStack_c10 = 0x40000000;
          uStack_c0c = 0x40000000;
          local_c48 = 0x4000000040000000;
          uStack_c40 = 0x4000000040000000;
          local_ba8 = local_5b8;
          uVar96 = local_ba8;
          uStack_ba0 = uStack_5b0;
          uVar97 = uStack_ba0;
          local_ba8._0_4_ = local_5b8._0_4_;
          local_ba8._4_4_ = local_5b8._4_4_;
          uStack_ba0._0_4_ = local_5b8._8_4_;
          uStack_ba0._4_4_ = local_5b8._12_4_;
          local_b88 = (float)local_ba8 * 2.0;
          fStack_b84 = local_ba8._4_4_ * 2.0;
          fStack_b80 = (float)uStack_ba0 * 2.0;
          fStack_b7c = uStack_ba0._4_4_ * 2.0;
          local_b4c = 0x3f800000;
          local_b68 = 0x3f800000;
          uStack_b64 = 0x3f800000;
          uStack_b60 = 0x3f800000;
          uStack_b5c = 0x3f800000;
          local_b98 = 0x3f8000003f800000;
          uStack_b90 = 0x3f8000003f800000;
          local_b78 = (undefined1  [16])0x0;
          local_7c8 = CONCAT44(fStack_b84,local_b88);
          uStack_7c0 = CONCAT44(fStack_b7c,fStack_b80);
          local_7b8 = 0;
          uStack_7b0 = 0;
          auVar52._8_8_ = uStack_7c0;
          auVar52._0_8_ = local_7c8;
          auVar7 = vsubps_avx(ZEXT816(0),auVar52);
          local_a88 = (undefined1  [16])0x0;
          local_ad8 = 0x3f800000;
          uStack_ad4 = 0x3f800000;
          uStack_ad0 = 0x3f800000;
          uStack_acc = 0x3f800000;
          local_a98._0_8_ = auVar7._0_8_;
          local_a98._8_8_ = auVar7._8_8_;
          local_838 = local_a98._0_8_;
          uStack_830 = local_a98._8_8_;
          local_848 = 0x42b0c0a5;
          uStack_844 = 0x42b0c0a5;
          uStack_840 = 0x42b0c0a5;
          uStack_83c = 0x42b0c0a5;
          auVar51._8_4_ = 0x42b0c0a5;
          auVar51._0_8_ = 0x42b0c0a542b0c0a5;
          auVar51._12_4_ = 0x42b0c0a5;
          auVar7 = vminps_avx(auVar7,auVar51);
          local_a98._0_8_ = auVar7._0_8_;
          local_a98._8_8_ = auVar7._8_8_;
          local_858 = local_a98._0_8_;
          uStack_850 = local_a98._8_8_;
          local_868 = 0xc2b0c0a5;
          uStack_864 = 0xc2b0c0a5;
          uStack_860 = 0xc2b0c0a5;
          uStack_85c = 0xc2b0c0a5;
          auVar50._8_4_ = 0xc2b0c0a5;
          auVar50._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar50._12_4_ = 0xc2b0c0a5;
          auVar6 = vmaxps_avx(auVar50,auVar7);
          local_a98._0_8_ = auVar6._0_8_;
          local_a98._8_8_ = auVar6._8_8_;
          local_998 = local_a98._0_8_;
          uVar102 = local_998;
          uStack_990 = local_a98._8_8_;
          uVar103 = uStack_990;
          local_9a8 = 0x3fb8aa3b;
          uStack_9a4 = 0x3fb8aa3b;
          uStack_9a0 = 0x3fb8aa3b;
          uStack_99c = 0x3fb8aa3b;
          local_998._0_4_ = auVar6._0_4_;
          local_998._4_4_ = auVar6._4_4_;
          uStack_990._0_4_ = auVar6._8_4_;
          uStack_990._4_4_ = auVar6._12_4_;
          local_ab8._4_4_ = local_998._4_4_ * 1.442695;
          local_ab8._0_4_ = (float)local_998 * 1.442695;
          uStack_ab0._0_4_ = (float)uStack_990 * 1.442695;
          uStack_ab0._4_4_ = uStack_990._4_4_ * 1.442695;
          local_7f8 = local_ab8;
          uStack_7f0 = uStack_ab0;
          local_808 = 0x3f000000;
          uStack_804 = 0x3f000000;
          uStack_800 = 0x3f000000;
          uStack_7fc = 0x3f000000;
          local_ab8._0_4_ = (float)local_998 * 1.442695 + 0.5;
          local_ab8._4_4_ = local_998._4_4_ * 1.442695 + 0.5;
          fVar120 = (float)uStack_990 * 1.442695 + 0.5;
          fVar121 = uStack_990._4_4_ * 1.442695 + 0.5;
          uStack_ab0._0_4_ = fVar120;
          uStack_ab0._4_4_ = fVar121;
          local_778 = local_ab8;
          uStack_770 = uStack_ab0;
          local_ac8._4_4_ = (int)(float)local_ab8._4_4_;
          local_ac8._0_4_ = (int)(float)local_ab8._0_4_;
          local_ac8._8_4_ = (int)fVar120;
          local_ac8._12_4_ = (int)fVar121;
          local_768 = local_ac8._0_8_;
          uStack_760 = local_ac8._8_8_;
          auVar54._8_8_ = local_ac8._8_8_;
          auVar54._0_8_ = local_ac8._0_8_;
          auVar5 = vcvtdq2ps_avx(auVar54);
          local_aa8 = auVar5._0_8_;
          uStack_aa0 = auVar5._8_8_;
          local_748 = local_aa8;
          uStack_740 = uStack_aa0;
          local_758 = local_ab8;
          uStack_750 = uStack_ab0;
          auVar55._8_8_ = uStack_ab0;
          auVar55._0_8_ = local_ab8;
          auVar7 = vcmpps_avx(auVar55,auVar5,1);
          local_ae8._0_8_ = auVar7._0_8_;
          local_ae8._8_8_ = auVar7._8_8_;
          local_738 = 0x3f8000003f800000;
          uStack_730 = 0x3f8000003f800000;
          local_728 = local_ae8._0_8_;
          uStack_720 = local_ae8._8_8_;
          auVar56._8_8_ = 0x3f8000003f800000;
          auVar56._0_8_ = 0x3f8000003f800000;
          local_ae8 = vpand_avx(auVar7,auVar56);
          local_7d8 = local_aa8;
          uStack_7d0 = uStack_aa0;
          local_7e8 = local_ae8._0_8_;
          uStack_7e0 = local_ae8._8_8_;
          _local_ab8 = vsubps_avx(auVar5,local_ae8);
          local_708 = local_ab8;
          local_6f8 = ::_ps_cephes_exp_C1;
          local_a78 = local_a98;
          local_678 = local_ab8;
          uStack_670 = uStack_ab0;
          local_688[0] = 0.6933594;
          local_688[1] = 0.6933594;
          afStack_680[0] = 0.6933594;
          afStack_680[1] = 0.6933594;
          local_698 = local_a98._0_8_;
          uStack_690 = local_a98._8_8_;
          auVar59._8_4_ = 0.6933594;
          auVar59._12_4_ = 0.6933594;
          auVar59._0_4_ = 0.6933594;
          auVar59._4_4_ = 0.6933594;
          auVar7 = vfnmadd213ps_fma(auVar59,_local_ab8,auVar6);
          local_710 = ::_ps_cephes_exp_C2;
          local_648 = local_ab8;
          uStack_640 = uStack_ab0;
          local_658[0] = -0.00021219444;
          local_658[1] = -0.00021219444;
          afStack_650[0] = -0.00021219444;
          afStack_650[1] = -0.00021219444;
          local_a98._0_8_ = auVar7._0_8_;
          local_668 = local_a98._0_8_;
          local_a98._8_8_ = auVar7._8_8_;
          uStack_660 = local_a98._8_8_;
          auVar60._8_4_ = -0.00021219444;
          auVar60._12_4_ = -0.00021219444;
          auVar60._0_4_ = -0.00021219444;
          auVar60._4_4_ = -0.00021219444;
          local_a98 = vfnmadd213ps_fma(auVar60,_local_ab8,auVar7);
          local_9b8 = local_a98._0_8_;
          uVar100 = local_9b8;
          uStack_9b0 = local_a98._8_8_;
          uVar101 = uStack_9b0;
          local_9c8 = local_a98._0_8_;
          uStack_9c0 = local_a98._8_8_;
          local_9b8._0_4_ = local_a98._0_4_;
          local_9b8._4_4_ = local_a98._4_4_;
          uStack_9b0._0_4_ = local_a98._8_4_;
          uStack_9b0._4_4_ = local_a98._12_4_;
          local_aa8._4_4_ = local_9b8._4_4_ * local_9b8._4_4_;
          local_aa8._0_4_ = (float)local_9b8 * (float)local_9b8;
          uStack_aa0._0_4_ = (float)uStack_9b0 * (float)uStack_9b0;
          uStack_aa0._4_4_ = uStack_9b0._4_4_ * uStack_9b0._4_4_;
          uStack_af0._0_4_ = 0x39506967;
          local_af8 = (undefined1  [8])0x3950696739506967;
          uStack_af0._4_4_ = 0x39506967;
          local_a68 = local_af8;
          local_a00 = ::_ps_cephes_exp_p1;
          local_968 = 0x3950696739506967;
          uStack_960 = uStack_af0;
          local_978 = local_a98._0_8_;
          uStack_970 = local_a98._8_8_;
          local_988[0] = 0.0013981999;
          local_988[1] = 0.0013981999;
          afStack_980[0] = 0.0013981999;
          afStack_980[1] = 0.0013981999;
          auVar45._8_4_ = 0.0013981999;
          auVar45._12_4_ = 0.0013981999;
          auVar45._0_4_ = 0.0013981999;
          auVar45._4_4_ = 0.0013981999;
          auVar7 = vfmadd213ps_fma(local_a98,_local_af8,auVar45);
          local_a18 = ::_ps_cephes_exp_p2;
          local_af8 = auVar7._0_8_;
          local_938 = local_af8;
          uStack_af0 = auVar7._8_8_;
          uStack_930 = uStack_af0;
          local_948 = local_a98._0_8_;
          uStack_940 = local_a98._8_8_;
          local_958[0] = 0.008333452;
          local_958[1] = 0.008333452;
          afStack_950[0] = 0.008333452;
          afStack_950[1] = 0.008333452;
          auVar46._8_4_ = 0.008333452;
          auVar46._12_4_ = 0.008333452;
          auVar46._0_4_ = 0.008333452;
          auVar46._4_4_ = 0.008333452;
          auVar7 = vfmadd213ps_fma(local_a98,auVar7,auVar46);
          local_a30 = ::_ps_cephes_exp_p3;
          local_af8 = auVar7._0_8_;
          local_908 = local_af8;
          uStack_af0 = auVar7._8_8_;
          uStack_900 = uStack_af0;
          local_918 = local_a98._0_8_;
          uStack_910 = local_a98._8_8_;
          local_928[0] = 0.041665796;
          local_928[1] = 0.041665796;
          afStack_920[0] = 0.041665796;
          afStack_920[1] = 0.041665796;
          auVar47._8_4_ = 0.041665796;
          auVar47._12_4_ = 0.041665796;
          auVar47._0_4_ = 0.041665796;
          auVar47._4_4_ = 0.041665796;
          auVar7 = vfmadd213ps_fma(local_a98,auVar7,auVar47);
          local_a48 = ::_ps_cephes_exp_p4;
          local_af8 = auVar7._0_8_;
          local_8d8 = local_af8;
          uStack_af0 = auVar7._8_8_;
          uStack_8d0 = uStack_af0;
          local_8e8 = local_a98._0_8_;
          uStack_8e0 = local_a98._8_8_;
          local_8f8[0] = 0.16666666;
          local_8f8[1] = 0.16666666;
          afStack_8f0[0] = 0.16666666;
          afStack_8f0[1] = 0.16666666;
          auVar48._8_4_ = 0.16666666;
          auVar48._12_4_ = 0.16666666;
          auVar48._0_4_ = 0.16666666;
          auVar48._4_4_ = 0.16666666;
          auVar7 = vfmadd213ps_fma(local_a98,auVar7,auVar48);
          local_a60 = ::_ps_cephes_exp_p5;
          local_af8 = auVar7._0_8_;
          local_8a8 = local_af8;
          uStack_af0 = auVar7._8_8_;
          uStack_8a0 = uStack_af0;
          local_8b8 = local_a98._0_8_;
          uStack_8b0 = local_a98._8_8_;
          local_8c8[0] = 0.5;
          local_8c8[1] = 0.5;
          afStack_8c0[0] = 0.5;
          afStack_8c0[1] = 0.5;
          auVar49._8_4_ = 0.5;
          auVar49._12_4_ = 0.5;
          auVar49._0_4_ = 0.5;
          auVar49._4_4_ = 0.5;
          auVar7 = vfmadd213ps_fma(local_a98,auVar7,auVar49);
          local_a70 = local_aa8;
          local_af8 = auVar7._0_8_;
          local_878 = local_af8;
          uStack_af0 = auVar7._8_8_;
          uStack_870 = uStack_af0;
          local_888 = local_aa8;
          uStack_880 = uStack_aa0;
          local_898 = local_a98._0_8_;
          uStack_890 = local_a98._8_8_;
          auVar7 = vfmadd213ps_fma(_local_aa8,auVar7,local_a98);
          local_af8 = auVar7._0_8_;
          uStack_af0 = auVar7._8_8_;
          local_828 = 0x3f8000003f800000;
          uStack_820 = 0x3f8000003f800000;
          local_818 = local_af8;
          uVar104 = local_818;
          uStack_810 = uStack_af0;
          uVar105 = uStack_810;
          local_818._0_4_ = auVar7._0_4_;
          local_818._4_4_ = auVar7._4_4_;
          uStack_810._0_4_ = auVar7._8_4_;
          uStack_810._4_4_ = auVar7._12_4_;
          local_af8._4_4_ = local_818._4_4_ + 1.0;
          local_af8._0_4_ = (float)local_818 + 1.0;
          uStack_af0._0_4_ = (float)uStack_810 + 1.0;
          uStack_af0._4_4_ = uStack_810._4_4_ + 1.0;
          local_788 = local_ab8;
          uVar106 = local_788;
          uStack_780 = uStack_ab0;
          uVar107 = uStack_780;
          local_788._0_4_ = local_ab8._0_4_;
          local_788._4_4_ = local_ab8._4_4_;
          uStack_780._0_4_ = local_ab8._8_4_;
          uStack_780._4_4_ = local_ab8._12_4_;
          local_ac8._4_4_ = (int)local_788._4_4_;
          local_ac8._0_4_ = (int)(float)local_788;
          local_ac8._8_4_ = (int)(float)uStack_780;
          local_ac8._12_4_ = (int)uStack_780._4_4_;
          local_6d8 = local_ac8._0_8_;
          uStack_6d0 = local_ac8._8_8_;
          local_6e8 = 0x7f0000007f;
          uStack_6e0 = 0x7f0000007f;
          auVar58._8_8_ = local_ac8._8_8_;
          auVar58._0_8_ = local_ac8._0_8_;
          auVar57._8_8_ = 0x7f0000007f;
          auVar57._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar58,auVar57);
          local_ac8._0_8_ = auVar7._0_8_;
          local_ac8._8_8_ = auVar7._8_8_;
          local_6b8 = local_ac8._0_8_;
          uStack_6b0 = local_ac8._8_8_;
          local_6bc = 0x17;
          local_ac8 = vpslld_avx(auVar7,ZEXT416(0x17));
          local_6a8 = local_ac8._0_8_;
          uStack_6a0 = local_ac8._8_8_;
          local_b08 = local_ac8._0_8_;
          uStack_b00 = local_ac8._8_8_;
          local_9d8 = _local_af8;
          local_9e8 = local_ac8._0_8_;
          uVar98 = local_9e8;
          uStack_9e0 = local_ac8._8_8_;
          uVar99 = uStack_9e0;
          local_9e8._0_4_ = local_ac8._0_4_;
          local_9e8._4_4_ = local_ac8._4_4_;
          uStack_9e0._0_4_ = local_ac8._8_4_;
          uStack_9e0._4_4_ = local_ac8._12_4_;
          local_af8._0_4_ = ((float)local_818 + 1.0) * (float)local_9e8;
          local_af8._4_4_ = (local_818._4_4_ + 1.0) * local_9e8._4_4_;
          uStack_9e0._0_4_ = ((float)uStack_810 + 1.0) * (float)uStack_9e0;
          uStack_9e0._4_4_ = (uStack_810._4_4_ + 1.0) * uStack_9e0._4_4_;
          uStack_af0._0_4_ = (float)uStack_9e0;
          uStack_af0._4_4_ = uStack_9e0._4_4_;
          local_b48 = local_af8;
          uStack_b40 = uStack_af0;
          local_b28 = (float)local_af8._0_4_ + 1.0;
          fStack_b24 = (float)local_af8._4_4_ + 1.0;
          fStack_b20 = (float)uStack_9e0 + 1.0;
          fStack_b1c = uStack_9e0._4_4_ + 1.0;
          auVar44._8_8_ = 0x3f8000003f800000;
          auVar44._0_8_ = 0x3f8000003f800000;
          auVar43._4_4_ = fStack_b24;
          auVar43._0_4_ = local_b28;
          auVar43._8_4_ = fStack_b20;
          auVar43._12_4_ = fStack_b1c;
          _local_bc8 = vdivps_avx(auVar44,auVar43);
          local_798._0_4_ = (float)local_bc8._0_4_ * 2.0;
          local_798._4_4_ = (float)local_bc8._4_4_ * 2.0;
          local_798._8_4_ = fStack_bc0 * 2.0;
          local_798._12_4_ = fStack_bbc * 2.0;
          auVar53._8_8_ = 0x3f8000003f800000;
          auVar53._0_8_ = 0x3f8000003f800000;
          _local_1738 = vsubps_avx(local_798,auVar53);
          local_1a08._4_4_ = local_16a8._4_4_ * (float)local_1738._4_4_;
          local_1a08._0_4_ = (float)local_16a8 * (float)local_1738._0_4_;
          uStack_1a00._0_4_ = (float)local_1728._8_4_ * fStack_1730;
          uStack_1a00._4_4_ = fStack_171c * fStack_172c;
          _local_1728 = local_2498;
          local_14d8 = local_14f8;
          local_14d0 = local_14e8;
          local_14c0 = local_14f8;
          local_14b8 = local_14e8;
          local_14a8 = local_14f8;
          local_14a0 = local_14e8;
          local_1490 = local_14f8;
          local_1488 = local_14e8;
          local_1478 = local_14f8;
          local_1470 = local_14e8;
          local_1468 = uVar8;
          uStack_1460 = uVar9;
          local_1438 = uVar88;
          uStack_1430 = uVar89;
          local_1418 = uVar90;
          uStack_1410 = uVar91;
          local_1298 = uVar92;
          uStack_1290 = uVar93;
          local_ec8 = uVar94;
          uStack_ec0 = uVar95;
          local_dd8 = local_14f8;
          local_dc0 = local_14f8;
          local_db0 = local_dc8;
          local_bd8 = local_c48;
          uStack_bd0 = uStack_c40;
          local_bb8 = local_c48;
          uStack_bb0 = uStack_c40;
          local_ba8 = uVar96;
          uStack_ba0 = uVar97;
          local_b38 = local_b98;
          uStack_b30 = uStack_b90;
          local_b18 = local_b98;
          uStack_b10 = uStack_b90;
          local_a58 = local_a78;
          local_a50 = local_a68;
          local_a40 = local_a78;
          local_a38 = local_a68;
          local_a28 = local_a78;
          local_a20 = local_a68;
          local_a10 = local_a78;
          local_a08 = local_a68;
          local_9f8 = local_a78;
          local_9f0 = local_a68;
          local_9e8 = uVar98;
          uStack_9e0 = uVar99;
          local_9b8 = uVar100;
          uStack_9b0 = uVar101;
          local_998 = uVar102;
          uStack_990 = uVar103;
          local_818 = uVar104;
          uStack_810 = uVar105;
          local_7a8 = local_c38;
          uStack_7a0 = uStack_c30;
          local_788 = uVar106;
          uStack_780 = uVar107;
          local_718 = local_a78;
          local_700 = local_a78;
          local_6f0 = local_708;
          local_570 = local_588;
          local_560 = local_598;
          local_558 = local_580;
          local_548 = local_598;
          local_540 = local_580;
          local_530 = local_598;
          local_528 = local_580;
          local_518 = local_598;
          local_510 = local_580;
          local_500 = local_598;
          local_4f8 = local_580;
          local_4e8 = local_598;
          local_4e0 = local_580;
          local_4d0 = local_598;
          local_4c8 = local_580;
          local_4b8 = local_598;
          local_4b0 = local_580;
          local_478 = uVar108;
          uStack_470 = uVar109;
          local_248 = uVar110;
          uStack_240 = uVar111;
          local_228 = uVar112;
          uStack_220 = uVar113;
          local_218 = uVar114;
          uStack_210 = uVar115;
          local_1f8 = uVar116;
          uStack_1f0 = uVar117;
          local_130 = local_580;
          break;
        case 6:
          local_1950 = in_stack_00000040;
          local_1958 = 0;
          local_19c8 = *(float *)*in_stack_00000040;
          local_1a58 = CONCAT44(local_19c8,local_19c8);
          uStack_1a50 = CONCAT44(local_19c8,local_19c8);
          local_1960 = in_stack_00000040;
          local_1968 = 1;
          local_19e8 = *(float *)(*in_stack_00000040 + 4);
          local_1a68 = CONCAT44(local_19e8,local_19e8);
          uStack_1a60 = CONCAT44(local_19e8,local_19e8);
          local_16e8 = local_2498;
          local_16ac = 0x3f800000;
          local_16c8 = 0x3f800000;
          uStack_16c4 = 0x3f800000;
          uStack_16c0 = 0x3f800000;
          uStack_16bc = 0x3f800000;
          local_1718 = 0x3f8000003f800000;
          uStack_1710 = 0x3f8000003f800000;
          local_1678 = local_2498._0_8_;
          uStack_1670 = local_2498._8_8_;
          local_1618 = (float)local_16a8 * local_19c8;
          fStack_1614 = local_16a8._4_4_ * local_19c8;
          fStack_1610 = (float)local_1728._8_4_ * local_19c8;
          fStack_160c = fStack_171c * local_19c8;
          local_1708._4_4_ = fStack_1614 + local_19e8;
          local_1708._0_4_ = local_1618 + local_19e8;
          uStack_1700._0_4_ = fStack_1610 + local_19e8;
          uStack_1700._4_4_ = fStack_160c + local_19e8;
          local_16d8 = (undefined1  [16])0x0;
          local_1658 = local_1708;
          uStack_1650 = uStack_1700;
          local_1668 = 0;
          uStack_1660 = 0;
          auVar12._8_8_ = uStack_1700;
          auVar12._0_8_ = local_1708;
          auVar7 = vmaxps_avx(auVar12,ZEXT816(0));
          local_1708 = auVar7._0_8_;
          uStack_1700 = auVar7._8_8_;
          local_1638 = local_1708;
          uStack_1630 = uStack_1700;
          auVar13._8_8_ = 0x3f8000003f800000;
          auVar13._0_8_ = 0x3f8000003f800000;
          _local_1708 = vminps_avx(auVar7,auVar13);
          local_16a8 = local_2498._0_8_;
          uStack_16a0 = local_2498._8_8_;
          local_1698._0_4_ = local_1708._0_4_;
          local_1698._4_4_ = local_1708._4_4_;
          fStack_1690 = local_1708._8_4_;
          fStack_168c = local_1708._12_4_;
          local_1a08._4_4_ = (float)local_1698._4_4_ * fVar121;
          local_1a08._0_4_ = (float)local_1698._0_4_ * fVar120;
          uStack_1a00._0_4_ = fStack_1690 * (float)local_1728._8_4_;
          uStack_1a00._4_4_ = fStack_168c * fStack_171c;
          fStack_19e4 = local_19e8;
          fStack_19e0 = local_19e8;
          fStack_19dc = local_19e8;
          local_19cc = local_19e8;
          fStack_19c4 = local_19c8;
          fStack_19c0 = local_19c8;
          fStack_19bc = local_19c8;
          local_19ac = local_19c8;
          local_16f8 = local_1a58;
          uStack_16f0 = uStack_1a50;
          _local_1698 = _local_1708;
          local_1688 = local_1a58;
          uStack_1680 = uStack_1a50;
          local_1648 = local_1718;
          uStack_1640 = uStack_1710;
          local_1628 = local_1a68;
          uStack_1620 = uStack_1a60;
          break;
        default:
          _local_1a08 = local_2498;
        }
        local_1900 = (undefined8 *)
                     (local_2440 + (long)((local_23c4 * local_237c + local_23c8) * 4) * 4);
        local_1918 = local_1a08;
        uStack_1910 = uStack_1a00;
        *local_1900 = local_1a08;
        local_1900[1] = uStack_1a00;
      }
    }
  }
  return;
}

Assistant:

static void deformableconv2d_pack1to4_sse(const std::vector<Mat>& bottom_blobs, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int pad_left, int pad_top, int activation_type, const Mat& activation_params, const Option& opt)
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];
    const bool has_mask = (bottom_blobs.size() == 3);
    const bool offset_not_pack = offset.elempack == 1;
    const bool mask_not_pack = has_mask ? bottom_blobs[2].elempack == 1 : true;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const int size = outw * outh;
    const int maxk = kernel_w * kernel_h;

    const float* bias_data_ptr = bias_data;
    const int elempack = 1;
    const int out_elempack = 4;
    const int wstep = out_elempack * elempack;
    const float zeros[out_elempack] = {0.f, 0.f, 0.f, 0.f};
    const float* zeros_ptr = zeros;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < outh; h_col++)
    {
        for (int w_col = 0; w_col < outw; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            for (int oc = 0; oc < outch; oc++)
            {
                const float* kptr = weight_data_packed.channel(oc);
                float* outptr = top_blob.channel(oc);
                __m128 _sum = _mm_setzero_ps();
                if (bias_data_ptr)
                    _sum = _mm_loadu_ps(bias_data_ptr + oc * out_elempack);
                for (int i = 0; i < kernel_h; i++)
                {
                    for (int j = 0; j < kernel_w; j++)
                    {
                        float offset_h = 0.f;
                        float offset_w = 0.f;
                        float mask_ = 1.f;
                        if (offset_not_pack)
                        {
                            offset_h = offset.channel((i * kernel_w + j) * 2).row(h_col)[w_col];
                            offset_w = offset.channel((i * kernel_w + j) * 2 + 1).row(h_col)[w_col];
                        }
                        else
                        {
                            const int y_c = (i * kernel_w + j) * 2;
                            const int x_c = (i * kernel_w + j) * 2 + 1;
                            offset_h = offset.channel(y_c / offset.elempack).row(h_col)[w_col * offset.elempack + y_c % offset.elempack];
                            offset_w = offset.channel(x_c / offset.elempack).row(h_col)[w_col * offset.elempack + x_c % offset.elempack];
                        }
                        if (has_mask)
                        {
                            const Mat& mask = bottom_blobs[2];
                            if (mask_not_pack)
                            {
                                mask_ = mask.channel(i * kernel_w + j).row(h_col)[w_col];
                            }
                            else
                            {
                                const int m_c = i * kernel_w + j;
                                mask_ = mask.channel(m_c / mask.elempack).row(h_col)[w_col * mask.elempack + m_c % mask.elempack];
                            }
                        }
                        const float h_im = h_in + i * dilation_h + offset_h;
                        const float w_im = w_in + j * dilation_w + offset_w;

                        // Bilinear
                        const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                        float w1 = 0.f;
                        float w2 = 0.f;
                        float w3 = 0.f;
                        float w4 = 0.f;
                        bool v1_cond = false;
                        bool v2_cond = false;
                        bool v3_cond = false;
                        bool v4_cond = false;
                        int v1_pos = 0;
                        int v2_pos = 0;
                        int v3_pos = 0;
                        int v4_pos = 0;
                        if (cond)
                        {
                            int h_low = (int)floorf(h_im);
                            int w_low = (int)floorf(w_im);
                            int h_high = h_low + 1;
                            int w_high = w_low + 1;

                            float lh = h_im - h_low;
                            float lw = w_im - w_low;
                            float hh = 1 - lh;
                            float hw = 1 - lw;

                            v1_cond = (h_low >= 0 && w_low >= 0);
                            v2_cond = (h_low >= 0 && w_high <= w - 1);
                            v3_cond = (h_high <= h - 1 && w_low >= 0);
                            v4_cond = (h_high <= h - 1 && w_high <= w - 1);
                            if (v1_cond)
                                v1_pos = h_low * w + w_low;
                            if (v2_cond)
                                v2_pos = h_low * w + w_high;
                            if (v3_cond)
                                v3_pos = h_high * w + w_low;
                            if (v4_cond)
                                v4_pos = h_high * w + w_high;

                            w1 = hh * hw;
                            w2 = hh * lw;
                            w3 = lh * hw;
                            w4 = lh * lw;
                        }
                        const float w1s[out_elempack] = {w1, w1, w1, w1};
                        const float* w1_ptr = w1s;
                        const float w2s[out_elempack] = {w2, w2, w2, w2};
                        const float* w2_ptr = w2s;
                        const float w3s[out_elempack] = {w3, w3, w3, w3};
                        const float* w3_ptr = w3s;
                        const float w4s[out_elempack] = {w4, w4, w4, w4};
                        const float* w4_ptr = w4s;
                        const float masks[out_elempack] = {mask_, mask_, mask_, mask_};
                        const float* mask_ptr = masks;

                        for (int ic = 0; ic < inch; ic++)
                        {
                            const float* data_im_ptr = bottom_blob.channel(ic);
                            __m128 _val_channel0 = _mm_loadu_ps(zeros_ptr);
                            if (cond)
                            {
                                __m128 _v1_channel0 = _val_channel0;
                                __m128 _v2_channel0 = _val_channel0;
                                __m128 _v3_channel0 = _val_channel0;
                                __m128 _v4_channel0 = _val_channel0;
                                if (v1_cond)
                                {
                                    _v1_channel0 = _mm_load1_ps(data_im_ptr + v1_pos);
                                }
                                if (v2_cond)
                                {
                                    _v2_channel0 = _mm_load1_ps(data_im_ptr + v2_pos);
                                }
                                if (v3_cond)
                                {
                                    _v3_channel0 = _mm_load1_ps(data_im_ptr + v3_pos);
                                }
                                if (v4_cond)
                                {
                                    _v4_channel0 = _mm_load1_ps(data_im_ptr + v4_pos);
                                }
                                __m128 _w1 = _mm_loadu_ps(w1_ptr);
                                __m128 _w2 = _mm_loadu_ps(w2_ptr);
                                __m128 _w3 = _mm_loadu_ps(w3_ptr);
                                __m128 _w4 = _mm_loadu_ps(w4_ptr);
                                _val_channel0 = _mm_comp_fmadd_ps(_v1_channel0, _w1, _val_channel0);
                                _val_channel0 = _mm_comp_fmadd_ps(_v2_channel0, _w2, _val_channel0);
                                _val_channel0 = _mm_comp_fmadd_ps(_v3_channel0, _w3, _val_channel0);
                                _val_channel0 = _mm_comp_fmadd_ps(_v4_channel0, _w4, _val_channel0);
                            }
                            if (has_mask)
                            {
                                __m128 _mask = _mm_loadu_ps(mask_ptr);
                                _val_channel0 = _mm_mul_ps(_val_channel0, _mask);
                            }
                            __m128 _conv_w0 = _mm_load_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val_channel0, _conv_w0, _sum);
                            kptr += wstep;
                        }
                    }
                }
                _sum = activation_sse(_sum, activation_type, activation_params);
                _mm_storeu_ps(outptr + (h_col * outw + w_col) * out_elempack, _sum);
            }
        }
    }
}